

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

bool embree::avx2::CurveNiIntersectorK<4,8>::
     occluded_h<embree::avx2::SweepCurve1IntersectorK<embree::HermiteCurveT,8>,embree::avx2::Occluded1KEpilog1<8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  Primitive PVar1;
  Geometry *pGVar2;
  RTCFilterFunctionN p_Var3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  int iVar21;
  long lVar22;
  undefined4 uVar23;
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [12];
  ulong uVar57;
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  byte bVar69;
  uint uVar70;
  int iVar71;
  undefined1 (*pauVar72) [32];
  uint uVar73;
  uint uVar74;
  ulong uVar75;
  ulong uVar76;
  bool bVar77;
  bool bVar78;
  float fVar79;
  undefined8 uVar81;
  float fVar113;
  vint4 bi_2;
  undefined1 auVar82 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  float fVar112;
  float fVar114;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined4 uVar80;
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar93 [16];
  undefined1 auVar109 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar110 [32];
  undefined1 extraout_var [60];
  undefined1 auVar111 [64];
  float fVar115;
  float fVar116;
  float fVar139;
  float fVar141;
  vint4 bi_1;
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  float fVar140;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [64];
  undefined1 auVar151 [16];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  float fVar187;
  vint4 ai_2;
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  float fVar189;
  float fVar190;
  float fVar191;
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  float fVar188;
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  vint4 ai;
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [28];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  vint4 bi;
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  vint4 ai_1;
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  float fVar240;
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar241 [16];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar246 [64];
  undefined1 auVar258 [32];
  float fVar250;
  float fVar251;
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  float fVar252;
  float fVar253;
  float fVar254;
  float fVar255;
  undefined1 auVar249 [32];
  undefined1 auVar256 [16];
  float fVar261;
  float fVar262;
  undefined1 auVar259 [64];
  undefined1 auVar260 [64];
  undefined1 auVar263 [32];
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  undefined1 auVar266 [16];
  undefined1 auVar267 [28];
  undefined1 auVar268 [32];
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [32];
  undefined1 auVar274 [32];
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  undefined1 auVar277 [32];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  int local_cc4;
  uint uStack_c04;
  float fStack_b9c;
  float fStack_b98;
  float fStack_b94;
  undefined1 local_b60 [8];
  float fStack_b58;
  float fStack_b54;
  float fStack_b50;
  float fStack_b4c;
  float fStack_b48;
  float fStack_b44;
  RTCFilterFunctionNArguments local_b10;
  undefined1 local_ae0 [32];
  undefined1 local_ac0 [8];
  float fStack_ab8;
  float fStack_ab4;
  float fStack_ab0;
  float fStack_aac;
  float fStack_aa8;
  undefined1 local_aa0 [8];
  float fStack_a98;
  float fStack_a94;
  uint uStack_a90;
  uint uStack_a8c;
  uint uStack_a88;
  uint uStack_a84;
  undefined1 local_a80 [32];
  undefined1 local_a60 [32];
  undefined1 local_a40 [8];
  float fStack_a38;
  float fStack_a34;
  undefined1 auStack_a30 [16];
  undefined1 local_a20 [16];
  undefined1 local_a10 [16];
  undefined1 local_a00 [8];
  float fStack_9f8;
  float fStack_9f4;
  float fStack_9f0;
  float fStack_9ec;
  float fStack_9e8;
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [8];
  float fStack_978;
  float fStack_974;
  float fStack_970;
  float fStack_96c;
  float fStack_968;
  float fStack_964;
  undefined1 local_960 [8];
  float fStack_958;
  float fStack_954;
  float fStack_950;
  float fStack_94c;
  float fStack_948;
  float fStack_944;
  undefined1 local_940 [32];
  undefined1 local_920 [16];
  Primitive *local_910;
  ulong local_908;
  undefined1 local_900 [8];
  float fStack_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  float fStack_8e8;
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [8];
  float fStack_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  float fStack_8a8;
  float fStack_8a4;
  undefined4 local_8a0;
  undefined4 uStack_89c;
  undefined4 uStack_898;
  undefined4 uStack_894;
  undefined4 uStack_890;
  undefined4 uStack_88c;
  undefined4 uStack_888;
  undefined4 uStack_884;
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  undefined1 local_860 [16];
  undefined1 auStack_850 [16];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  uint local_7c0;
  uint uStack_7bc;
  uint uStack_7b8;
  uint uStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float fStack_7a8;
  uint uStack_7a4;
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6b0 [16];
  undefined1 local_6a0 [16];
  undefined1 local_690 [16];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  uint local_640;
  uint uStack_63c;
  uint uStack_638;
  uint uStack_634;
  uint uStack_630;
  uint uStack_62c;
  uint uStack_628;
  uint uStack_624;
  uint local_620;
  uint uStack_61c;
  uint uStack_618;
  uint uStack_614;
  uint uStack_610;
  uint uStack_60c;
  uint uStack_608;
  uint uStack_604;
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  float local_5a0;
  float fStack_59c;
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  float local_580;
  float fStack_57c;
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined4 local_4e0;
  undefined4 uStack_4dc;
  undefined4 uStack_4d8;
  undefined4 uStack_4d4;
  undefined4 uStack_4d0;
  undefined4 uStack_4cc;
  undefined4 uStack_4c8;
  undefined4 uStack_4c4;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined1 local_4a0 [32];
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined1 local_460 [32];
  uint local_440;
  uint uStack_43c;
  uint uStack_438;
  uint uStack_434;
  uint uStack_430;
  uint uStack_42c;
  uint uStack_428;
  uint uStack_424;
  uint local_420;
  uint uStack_41c;
  uint uStack_418;
  uint uStack_414;
  uint uStack_410;
  uint uStack_40c;
  uint uStack_408;
  uint uStack_404;
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  float local_3a0;
  float fStack_39c;
  float fStack_398;
  float fStack_394;
  undefined4 uStack_390;
  undefined4 uStack_38c;
  undefined4 uStack_388;
  undefined4 uStack_384;
  undefined1 local_380 [32];
  float local_360;
  float fStack_35c;
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  float local_340;
  float fStack_33c;
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  undefined8 uStack_140;
  int aiStack_138 [66];
  undefined1 extraout_var_00 [60];
  undefined1 auVar257 [16];
  
  PVar1 = prim[1];
  uVar75 = (ulong)(byte)PVar1;
  fVar79 = *(float *)(prim + uVar75 * 0x19 + 0x12);
  auVar4 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x10
                        );
  auVar4 = vinsertps_avx(auVar4,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar5 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                         ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar5 = vinsertps_avx(auVar5,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar4 = vsubps_avx(auVar4,*(undefined1 (*) [16])(prim + uVar75 * 0x19 + 6));
  auVar82._0_4_ = fVar79 * auVar4._0_4_;
  auVar82._4_4_ = fVar79 * auVar4._4_4_;
  auVar82._8_4_ = fVar79 * auVar4._8_4_;
  auVar82._12_4_ = fVar79 * auVar4._12_4_;
  auVar210._0_4_ = fVar79 * auVar5._0_4_;
  auVar210._4_4_ = fVar79 * auVar5._4_4_;
  auVar210._8_4_ = fVar79 * auVar5._8_4_;
  auVar210._12_4_ = fVar79 * auVar5._12_4_;
  auVar4 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar75 * 4 + 6)));
  auVar4 = vcvtdq2ps_avx(auVar4);
  auVar5 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar75 * 5 + 6)));
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar6 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar75 * 6 + 6)));
  auVar6 = vcvtdq2ps_avx(auVar6);
  auVar7 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar75 * 0xb + 6)));
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar8 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar1 * 0xc) + 6)));
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar9 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar1 * 0xc + uVar75 + 6)));
  auVar9 = vcvtdq2ps_avx(auVar9);
  uVar76 = (ulong)(uint)((int)(uVar75 * 9) * 2);
  auVar84 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar76 + 6)));
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar83 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar76 + uVar75 + 6)));
  auVar83 = vcvtdq2ps_avx(auVar83);
  uVar76 = (ulong)(uint)((int)(uVar75 * 5) << 2);
  auVar151 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar76 + 6)));
  auVar151 = vcvtdq2ps_avx(auVar151);
  auVar271._4_4_ = auVar210._0_4_;
  auVar271._0_4_ = auVar210._0_4_;
  auVar271._8_4_ = auVar210._0_4_;
  auVar271._12_4_ = auVar210._0_4_;
  auVar118 = vshufps_avx(auVar210,auVar210,0x55);
  auVar90 = vshufps_avx(auVar210,auVar210,0xaa);
  fVar79 = auVar90._0_4_;
  auVar256._0_4_ = fVar79 * auVar6._0_4_;
  fVar112 = auVar90._4_4_;
  auVar256._4_4_ = fVar112 * auVar6._4_4_;
  fVar113 = auVar90._8_4_;
  auVar256._8_4_ = fVar113 * auVar6._8_4_;
  fVar114 = auVar90._12_4_;
  auVar256._12_4_ = fVar114 * auVar6._12_4_;
  auVar247._0_4_ = auVar9._0_4_ * fVar79;
  auVar247._4_4_ = auVar9._4_4_ * fVar112;
  auVar247._8_4_ = auVar9._8_4_ * fVar113;
  auVar247._12_4_ = auVar9._12_4_ * fVar114;
  auVar235._0_4_ = auVar151._0_4_ * fVar79;
  auVar235._4_4_ = auVar151._4_4_ * fVar112;
  auVar235._8_4_ = auVar151._8_4_ * fVar113;
  auVar235._12_4_ = auVar151._12_4_ * fVar114;
  auVar90 = vfmadd231ps_fma(auVar256,auVar118,auVar5);
  auVar86 = vfmadd231ps_fma(auVar247,auVar118,auVar8);
  auVar118 = vfmadd231ps_fma(auVar235,auVar83,auVar118);
  auVar166 = vfmadd231ps_fma(auVar90,auVar271,auVar4);
  auVar86 = vfmadd231ps_fma(auVar86,auVar271,auVar7);
  auVar193 = vfmadd231ps_fma(auVar118,auVar84,auVar271);
  auVar272._4_4_ = auVar82._0_4_;
  auVar272._0_4_ = auVar82._0_4_;
  auVar272._8_4_ = auVar82._0_4_;
  auVar272._12_4_ = auVar82._0_4_;
  auVar118 = vshufps_avx(auVar82,auVar82,0x55);
  auVar90 = vshufps_avx(auVar82,auVar82,0xaa);
  fVar79 = auVar90._0_4_;
  auVar211._0_4_ = fVar79 * auVar6._0_4_;
  fVar112 = auVar90._4_4_;
  auVar211._4_4_ = fVar112 * auVar6._4_4_;
  fVar113 = auVar90._8_4_;
  auVar211._8_4_ = fVar113 * auVar6._8_4_;
  fVar114 = auVar90._12_4_;
  auVar211._12_4_ = fVar114 * auVar6._12_4_;
  auVar117._0_4_ = auVar9._0_4_ * fVar79;
  auVar117._4_4_ = auVar9._4_4_ * fVar112;
  auVar117._8_4_ = auVar9._8_4_ * fVar113;
  auVar117._12_4_ = auVar9._12_4_ * fVar114;
  auVar90._0_4_ = auVar151._0_4_ * fVar79;
  auVar90._4_4_ = auVar151._4_4_ * fVar112;
  auVar90._8_4_ = auVar151._8_4_ * fVar113;
  auVar90._12_4_ = auVar151._12_4_ * fVar114;
  auVar5 = vfmadd231ps_fma(auVar211,auVar118,auVar5);
  auVar6 = vfmadd231ps_fma(auVar117,auVar118,auVar8);
  auVar8 = vfmadd231ps_fma(auVar90,auVar118,auVar83);
  auVar9 = vfmadd231ps_fma(auVar5,auVar272,auVar4);
  auVar83 = vfmadd231ps_fma(auVar6,auVar272,auVar7);
  auVar151 = vfmadd231ps_fma(auVar8,auVar272,auVar84);
  auVar230._8_4_ = 0x7fffffff;
  auVar230._0_8_ = 0x7fffffff7fffffff;
  auVar230._12_4_ = 0x7fffffff;
  auVar4 = vandps_avx(auVar166,auVar230);
  auVar192._8_4_ = 0x219392ef;
  auVar192._0_8_ = 0x219392ef219392ef;
  auVar192._12_4_ = 0x219392ef;
  auVar4 = vcmpps_avx(auVar4,auVar192,1);
  auVar5 = vblendvps_avx(auVar166,auVar192,auVar4);
  auVar4 = vandps_avx(auVar86,auVar230);
  auVar4 = vcmpps_avx(auVar4,auVar192,1);
  auVar6 = vblendvps_avx(auVar86,auVar192,auVar4);
  auVar4 = vandps_avx(auVar193,auVar230);
  auVar4 = vcmpps_avx(auVar4,auVar192,1);
  auVar4 = vblendvps_avx(auVar193,auVar192,auVar4);
  auVar7 = vrcpps_avx(auVar5);
  auVar231._8_4_ = 0x3f800000;
  auVar231._0_8_ = 0x3f8000003f800000;
  auVar231._12_4_ = 0x3f800000;
  auVar5 = vfnmadd213ps_fma(auVar5,auVar7,auVar231);
  auVar7 = vfmadd132ps_fma(auVar5,auVar7,auVar7);
  auVar5 = vrcpps_avx(auVar6);
  auVar6 = vfnmadd213ps_fma(auVar6,auVar5,auVar231);
  auVar8 = vfmadd132ps_fma(auVar6,auVar5,auVar5);
  auVar5 = vrcpps_avx(auVar4);
  auVar4 = vfnmadd213ps_fma(auVar4,auVar5,auVar231);
  auVar84 = vfmadd132ps_fma(auVar4,auVar5,auVar5);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)(prim + uVar75 * 7 + 6);
  auVar4 = vpmovsxwd_avx(auVar4);
  auVar4 = vcvtdq2ps_avx(auVar4);
  auVar4 = vsubps_avx(auVar4,auVar9);
  auVar193._0_4_ = auVar7._0_4_ * auVar4._0_4_;
  auVar193._4_4_ = auVar7._4_4_ * auVar4._4_4_;
  auVar193._8_4_ = auVar7._8_4_ * auVar4._8_4_;
  auVar193._12_4_ = auVar7._12_4_ * auVar4._12_4_;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + uVar75 * 9 + 6);
  auVar4 = vpmovsxwd_avx(auVar5);
  auVar4 = vcvtdq2ps_avx(auVar4);
  auVar4 = vsubps_avx(auVar4,auVar9);
  auVar212._0_4_ = auVar7._0_4_ * auVar4._0_4_;
  auVar212._4_4_ = auVar7._4_4_ * auVar4._4_4_;
  auVar212._8_4_ = auVar7._8_4_ * auVar4._8_4_;
  auVar212._12_4_ = auVar7._12_4_ * auVar4._12_4_;
  auVar86._1_3_ = 0;
  auVar86[0] = PVar1;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar1 * 0x10 + 6);
  auVar5 = vpmovsxwd_avx(auVar6);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar1 * 0x10 + uVar75 * -2 + 6);
  auVar4 = vpmovsxwd_avx(auVar7);
  auVar4 = vcvtdq2ps_avx(auVar4);
  auVar4 = vsubps_avx(auVar4,auVar83);
  auVar236._0_4_ = auVar4._0_4_ * auVar8._0_4_;
  auVar236._4_4_ = auVar4._4_4_ * auVar8._4_4_;
  auVar236._8_4_ = auVar4._8_4_ * auVar8._8_4_;
  auVar236._12_4_ = auVar4._12_4_ * auVar8._12_4_;
  auVar4 = vcvtdq2ps_avx(auVar5);
  auVar4 = vsubps_avx(auVar4,auVar83);
  auVar118._0_4_ = auVar8._0_4_ * auVar4._0_4_;
  auVar118._4_4_ = auVar8._4_4_ * auVar4._4_4_;
  auVar118._8_4_ = auVar8._8_4_ * auVar4._8_4_;
  auVar118._12_4_ = auVar8._12_4_ * auVar4._12_4_;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar76 + uVar75 + 6);
  auVar4 = vpmovsxwd_avx(auVar8);
  auVar4 = vcvtdq2ps_avx(auVar4);
  auVar4 = vsubps_avx(auVar4,auVar151);
  auVar166._0_4_ = auVar84._0_4_ * auVar4._0_4_;
  auVar166._4_4_ = auVar84._4_4_ * auVar4._4_4_;
  auVar166._8_4_ = auVar84._8_4_ * auVar4._8_4_;
  auVar166._12_4_ = auVar84._12_4_ * auVar4._12_4_;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar75 * 0x17 + 6);
  auVar4 = vpmovsxwd_avx(auVar9);
  auVar4 = vcvtdq2ps_avx(auVar4);
  auVar4 = vsubps_avx(auVar4,auVar151);
  auVar83._0_4_ = auVar84._0_4_ * auVar4._0_4_;
  auVar83._4_4_ = auVar84._4_4_ * auVar4._4_4_;
  auVar83._8_4_ = auVar84._8_4_ * auVar4._8_4_;
  auVar83._12_4_ = auVar84._12_4_ * auVar4._12_4_;
  auVar4 = vpminsd_avx(auVar193,auVar212);
  auVar5 = vpminsd_avx(auVar236,auVar118);
  auVar4 = vmaxps_avx(auVar4,auVar5);
  auVar5 = vpminsd_avx(auVar166,auVar83);
  uVar80 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar241._4_4_ = uVar80;
  auVar241._0_4_ = uVar80;
  auVar241._8_4_ = uVar80;
  auVar241._12_4_ = uVar80;
  auVar5 = vmaxps_avx(auVar5,auVar241);
  auVar4 = vmaxps_avx(auVar4,auVar5);
  local_6a0._0_4_ = auVar4._0_4_ * 0.99999964;
  local_6a0._4_4_ = auVar4._4_4_ * 0.99999964;
  local_6a0._8_4_ = auVar4._8_4_ * 0.99999964;
  local_6a0._12_4_ = auVar4._12_4_ * 0.99999964;
  auVar4 = vpmaxsd_avx(auVar193,auVar212);
  auVar5 = vpmaxsd_avx(auVar236,auVar118);
  auVar4 = vminps_avx(auVar4,auVar5);
  auVar5 = vpmaxsd_avx(auVar166,auVar83);
  uVar80 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar151._4_4_ = uVar80;
  auVar151._0_4_ = uVar80;
  auVar151._8_4_ = uVar80;
  auVar151._12_4_ = uVar80;
  auVar5 = vminps_avx(auVar5,auVar151);
  auVar4 = vminps_avx(auVar4,auVar5);
  auVar84._0_4_ = auVar4._0_4_ * 1.0000004;
  auVar84._4_4_ = auVar4._4_4_ * 1.0000004;
  auVar84._8_4_ = auVar4._8_4_ * 1.0000004;
  auVar84._12_4_ = auVar4._12_4_ * 1.0000004;
  auVar86[4] = PVar1;
  auVar86._5_3_ = 0;
  auVar86[8] = PVar1;
  auVar86._9_3_ = 0;
  auVar86[0xc] = PVar1;
  auVar86._13_3_ = 0;
  auVar5 = vpcmpgtd_avx(auVar86,_DAT_01f7fcf0);
  auVar4 = vcmpps_avx(local_6a0,auVar84,2);
  auVar4 = vandps_avx(auVar4,auVar5);
  uVar70 = vmovmskps_avx(auVar4);
  if (uVar70 == 0) {
    return false;
  }
  uVar70 = uVar70 & 0xff;
  auVar95._16_16_ = mm_lookupmask_ps._240_16_;
  auVar95._0_16_ = mm_lookupmask_ps._240_16_;
  local_5c0 = vblendps_avx(auVar95,ZEXT832(0) << 0x20,0x80);
  iVar71 = 1 << ((uint)k & 0x1f);
  auVar96._4_4_ = iVar71;
  auVar96._0_4_ = iVar71;
  auVar96._8_4_ = iVar71;
  auVar96._12_4_ = iVar71;
  auVar96._16_4_ = iVar71;
  auVar96._20_4_ = iVar71;
  auVar96._24_4_ = iVar71;
  auVar96._28_4_ = iVar71;
  auVar164 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar95 = vpand_avx2(auVar96,auVar164);
  local_680 = vpcmpeqd_avx2(auVar95,auVar164);
  local_8a0 = 0x7fffffff;
  uStack_89c = 0x7fffffff;
  uStack_898 = 0x7fffffff;
  uStack_894 = 0x7fffffff;
  uStack_890 = 0x7fffffff;
  uStack_88c = 0x7fffffff;
  uStack_888 = 0x7fffffff;
  uStack_884 = 0x7fffffff;
  local_7c0 = 0x80000000;
  uStack_7bc = 0x80000000;
  uStack_7b8 = 0x80000000;
  uStack_7b4 = 0x80000000;
  fStack_7b0 = -0.0;
  fStack_7ac = -0.0;
  fStack_7a8 = -0.0;
  uStack_7a4 = 0x80000000;
  local_910 = prim;
LAB_015e657b:
  lVar22 = 0;
  local_908 = (ulong)uVar70;
  for (uVar76 = local_908; (uVar76 & 1) == 0; uVar76 = uVar76 >> 1 | 0x8000000000000000) {
    lVar22 = lVar22 + 1;
  }
  uVar70 = *(uint *)(local_910 + 2);
  local_640 = *(uint *)(local_910 + lVar22 * 4 + 6);
  pGVar2 = (context->scene->geometries).items[uVar70].ptr;
  lVar22 = *(long *)&pGVar2[1].time_range.upper;
  uVar76 = (ulong)*(uint *)(*(long *)&pGVar2->field_0x58 +
                           (ulong)local_640 *
                           pGVar2[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  auVar4 = *(undefined1 (*) [16])(lVar22 + (long)pGVar2[1].intersectionFilterN * uVar76);
  auVar5 = *(undefined1 (*) [16])(lVar22 + (long)pGVar2[1].intersectionFilterN * (uVar76 + 1));
  auVar6 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x1c
                        );
  auVar7 = vinsertps_avx(auVar6,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  uVar80 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar248._4_4_ = uVar80;
  auVar248._0_4_ = uVar80;
  auVar248._8_4_ = uVar80;
  auVar248._12_4_ = uVar80;
  fStack_870 = (float)uVar80;
  _local_880 = auVar248;
  fStack_86c = (float)uVar80;
  fStack_868 = (float)uVar80;
  register0x0000149c = uVar80;
  uVar80 = *(undefined4 *)(ray + k * 4 + 0xa0);
  auVar257._4_4_ = uVar80;
  auVar257._0_4_ = uVar80;
  auVar257._8_4_ = uVar80;
  auVar257._12_4_ = uVar80;
  fStack_ab0 = (float)uVar80;
  _local_ac0 = auVar257;
  fStack_aac = (float)uVar80;
  fStack_aa8 = (float)uVar80;
  register0x000014dc = uVar80;
  auVar259 = ZEXT3264(_local_ac0);
  auVar6 = vunpcklps_avx(auVar248,auVar257);
  fVar79 = *(float *)(ray + k * 4 + 0xc0);
  auVar266._4_4_ = fVar79;
  auVar266._0_4_ = fVar79;
  auVar266._8_4_ = fVar79;
  auVar266._12_4_ = fVar79;
  fStack_9f0 = fVar79;
  _local_a00 = auVar266;
  fStack_9ec = fVar79;
  fStack_9e8 = fVar79;
  register0x0000155c = fVar79;
  local_a10 = vinsertps_avx(auVar6,auVar266,0x28);
  auVar213._8_4_ = 0xbeaaaaab;
  auVar213._0_8_ = 0xbeaaaaabbeaaaaab;
  auVar213._12_4_ = 0xbeaaaaab;
  auVar84 = vfnmadd132ps_fma(*(undefined1 (*) [16])
                              (pGVar2[2].intersectionFilterN +
                              uVar76 * (long)pGVar2[2].pointQueryFunc),auVar4,auVar213);
  auVar9 = vfmadd132ps_fma(*(undefined1 (*) [16])
                            (pGVar2[2].intersectionFilterN +
                            (long)pGVar2[2].pointQueryFunc * (uVar76 + 1)),auVar5,auVar213);
  auVar214._0_4_ = (auVar5._0_4_ + auVar4._0_4_ + auVar84._0_4_ + auVar9._0_4_) * 0.25;
  auVar214._4_4_ = (auVar5._4_4_ + auVar4._4_4_ + auVar84._4_4_ + auVar9._4_4_) * 0.25;
  auVar214._8_4_ = (auVar5._8_4_ + auVar4._8_4_ + auVar84._8_4_ + auVar9._8_4_) * 0.25;
  auVar214._12_4_ = (auVar5._12_4_ + auVar4._12_4_ + auVar84._12_4_ + auVar9._12_4_) * 0.25;
  auVar6 = vsubps_avx(auVar214,auVar7);
  auVar6 = vdpps_avx(auVar6,local_a10,0x7f);
  local_a20 = vdpps_avx(local_a10,local_a10,0x7f);
  auVar246 = ZEXT1664(local_a20);
  auVar8 = vrcpss_avx(local_a20,local_a20);
  auVar83 = vfnmadd213ss_fma(auVar8,local_a20,ZEXT416(0x40000000));
  local_360 = auVar6._0_4_ * auVar8._0_4_ * auVar83._0_4_;
  auVar225._4_4_ = local_360;
  auVar225._0_4_ = local_360;
  auVar225._8_4_ = local_360;
  auVar225._12_4_ = local_360;
  fStack_950 = local_360;
  _local_960 = auVar225;
  fStack_94c = local_360;
  fStack_948 = local_360;
  fStack_944 = local_360;
  auVar6 = vfmadd231ps_fma(auVar7,local_a10,auVar225);
  auVar6 = vblendps_avx(auVar6,_DAT_01f7aa10,8);
  auVar7 = vsubps_avx(auVar4,auVar6);
  auVar8 = vsubps_avx(auVar9,auVar6);
  auVar9 = vsubps_avx(auVar84,auVar6);
  auVar6 = vsubps_avx(auVar5,auVar6);
  auVar4 = vmovshdup_avx(auVar7);
  uVar81 = auVar4._0_8_;
  auVar263._8_8_ = uVar81;
  auVar263._0_8_ = uVar81;
  auVar263._16_8_ = uVar81;
  auVar263._24_8_ = uVar81;
  auVar4 = vshufps_avx(auVar7,auVar7,0xaa);
  uVar81 = auVar4._0_8_;
  auVar274._8_8_ = uVar81;
  auVar274._0_8_ = uVar81;
  auVar274._16_8_ = uVar81;
  auVar274._24_8_ = uVar81;
  auVar4 = vshufps_avx(auVar7,auVar7,0xff);
  local_1e0 = auVar4._0_8_;
  uStack_1d8 = local_1e0;
  uStack_1d0 = local_1e0;
  uStack_1c8 = local_1e0;
  auVar4 = vmovshdup_avx(auVar9);
  uVar81 = auVar4._0_8_;
  local_5e0._8_8_ = uVar81;
  local_5e0._0_8_ = uVar81;
  local_5e0._16_8_ = uVar81;
  local_5e0._24_8_ = uVar81;
  auVar4 = vshufps_avx(auVar9,auVar9,0xaa);
  local_200 = auVar4._0_8_;
  uStack_1f8 = local_200;
  uStack_1f0 = local_200;
  uStack_1e8 = local_200;
  auVar4 = vshufps_avx(auVar9,auVar9,0xff);
  uVar81 = auVar4._0_8_;
  local_ae0._8_8_ = uVar81;
  local_ae0._0_8_ = uVar81;
  local_ae0._16_8_ = uVar81;
  local_ae0._24_8_ = uVar81;
  auVar4 = vmovshdup_avx(auVar8);
  local_580 = auVar4._0_4_;
  fStack_57c = auVar4._4_4_;
  auVar4 = vshufps_avx(auVar8,auVar8,0xaa);
  local_220 = auVar4._0_8_;
  uStack_218 = local_220;
  uStack_210 = local_220;
  uStack_208 = local_220;
  auVar4 = vshufps_avx(auVar8,auVar8,0xff);
  local_5a0 = auVar4._0_4_;
  fStack_59c = auVar4._4_4_;
  auVar4 = vmovshdup_avx(auVar6);
  local_240 = auVar4._0_8_;
  uStack_238 = local_240;
  uStack_230 = local_240;
  uStack_228 = local_240;
  auVar4 = vshufps_avx(auVar6,auVar6,0xaa);
  local_260 = auVar4._0_8_;
  uStack_258 = local_260;
  uStack_250 = local_260;
  uStack_248 = local_260;
  auVar4 = vshufps_avx(auVar6,auVar6,0xff);
  local_280 = auVar4._0_8_;
  uStack_278 = local_280;
  uStack_270 = local_280;
  uStack_268 = local_280;
  auVar4 = vfmadd231ps_fma(ZEXT432((uint)(fVar79 * fVar79)),_local_ac0,_local_ac0);
  auVar4 = vfmadd231ps_fma(ZEXT1632(auVar4),_local_880,_local_880);
  uVar80 = auVar4._0_4_;
  local_2a0._4_4_ = uVar80;
  local_2a0._0_4_ = uVar80;
  local_2a0._8_4_ = uVar80;
  local_2a0._12_4_ = uVar80;
  local_2a0._16_4_ = uVar80;
  local_2a0._20_4_ = uVar80;
  local_2a0._24_4_ = uVar80;
  local_2a0._28_4_ = uVar80;
  fVar79 = *(float *)(ray + k * 4 + 0x60);
  local_920 = ZEXT416((uint)local_360);
  local_360 = fVar79 - local_360;
  fStack_35c = local_360;
  fStack_358 = local_360;
  fStack_354 = local_360;
  fStack_350 = local_360;
  fStack_34c = local_360;
  fStack_348 = local_360;
  fStack_344 = local_360;
  uVar76 = 0;
  bVar77 = false;
  local_cc4 = 1;
  uVar80 = auVar7._0_4_;
  local_2e0._4_4_ = uVar80;
  local_2e0._0_4_ = uVar80;
  local_2e0._8_4_ = uVar80;
  local_2e0._12_4_ = uVar80;
  local_2e0._16_4_ = uVar80;
  local_2e0._20_4_ = uVar80;
  local_2e0._24_4_ = uVar80;
  local_2e0._28_4_ = uVar80;
  fVar113 = auVar9._0_4_;
  local_300._4_4_ = fVar113;
  local_300._0_4_ = fVar113;
  local_300._8_4_ = fVar113;
  local_300._12_4_ = fVar113;
  local_300._16_4_ = fVar113;
  local_300._20_4_ = fVar113;
  local_300._24_4_ = fVar113;
  local_300._28_4_ = fVar113;
  fVar114 = auVar8._0_4_;
  local_320._4_4_ = fVar114;
  local_320._0_4_ = fVar114;
  local_320._8_4_ = fVar114;
  local_320._12_4_ = fVar114;
  local_320._16_4_ = fVar114;
  local_320._20_4_ = fVar114;
  local_320._24_4_ = fVar114;
  local_320._28_4_ = fVar114;
  fVar112 = auVar6._0_4_;
  auVar164._4_4_ = uStack_89c;
  auVar164._0_4_ = local_8a0;
  auVar164._8_4_ = uStack_898;
  auVar164._12_4_ = uStack_894;
  auVar164._16_4_ = uStack_890;
  auVar164._20_4_ = uStack_88c;
  auVar164._24_4_ = uStack_888;
  auVar164._28_4_ = uStack_884;
  local_600 = vandps_avx(local_2a0,auVar164);
  auVar4 = vsqrtss_avx(local_a20,local_a20);
  auVar5 = vsqrtss_avx(local_a20,local_a20);
  local_690 = ZEXT816(0x3f80000000000000);
  local_340 = fVar112;
  fStack_33c = fVar112;
  fStack_338 = fVar112;
  fStack_334 = fVar112;
  fStack_330 = fVar112;
  fStack_32c = fVar112;
  fStack_328 = fVar112;
  fStack_324 = fVar112;
  uStack_63c = local_640;
  uStack_638 = local_640;
  uStack_634 = local_640;
  uStack_630 = local_640;
  uStack_62c = local_640;
  uStack_628 = local_640;
  uStack_624 = local_640;
  local_620 = uVar70;
  uStack_61c = uVar70;
  uStack_618 = uVar70;
  uStack_614 = uVar70;
  uStack_610 = uVar70;
  uStack_60c = uVar70;
  uStack_608 = uVar70;
  uStack_604 = uVar70;
  fStack_598 = local_5a0;
  fStack_594 = fStack_59c;
  fStack_590 = local_5a0;
  fStack_58c = fStack_59c;
  fStack_588 = local_5a0;
  fStack_584 = fStack_59c;
  fStack_578 = local_580;
  fStack_574 = fStack_57c;
  fStack_570 = local_580;
  fStack_56c = fStack_57c;
  fStack_568 = local_580;
  fStack_564 = fStack_57c;
  auVar95 = local_2a0;
  do {
    auVar201._8_4_ = 0x3f800000;
    auVar201._0_8_ = 0x3f8000003f800000;
    auVar201._12_4_ = 0x3f800000;
    auVar201._16_4_ = 0x3f800000;
    auVar201._20_4_ = 0x3f800000;
    iVar71 = (int)uVar76;
    auVar201._24_4_ = 0x3f800000;
    auVar201._28_4_ = 0x3f800000;
    auVar84 = vmovshdup_avx(local_690);
    auVar84 = vsubps_avx(auVar84,local_690);
    fVar142 = auVar84._0_4_;
    fVar149 = fVar142 * 0.04761905;
    local_800._0_4_ = local_690._0_4_;
    local_800._4_4_ = local_800._0_4_;
    local_800._8_4_ = local_800._0_4_;
    local_800._12_4_ = local_800._0_4_;
    local_800._16_4_ = local_800._0_4_;
    local_800._20_4_ = local_800._0_4_;
    local_800._24_4_ = local_800._0_4_;
    local_800._28_4_ = local_800._0_4_;
    local_820._4_4_ = fVar142;
    local_820._0_4_ = fVar142;
    local_820._8_4_ = fVar142;
    local_820._12_4_ = fVar142;
    local_820._16_4_ = fVar142;
    local_820._20_4_ = fVar142;
    local_820._24_4_ = fVar142;
    local_820._28_4_ = fVar142;
    auVar84 = vfmadd231ps_fma(local_800,local_820,_DAT_01faff20);
    auVar164 = vsubps_avx(auVar201,ZEXT1632(auVar84));
    fVar116 = auVar84._0_4_;
    auVar260._0_4_ = local_300._0_4_ * fVar116;
    fVar115 = auVar84._4_4_;
    auVar260._4_4_ = local_300._4_4_ * fVar115;
    fVar140 = auVar84._8_4_;
    auVar260._8_4_ = local_300._8_4_ * fVar140;
    fVar139 = auVar84._12_4_;
    auVar260._12_4_ = local_300._12_4_ * fVar139;
    auVar260._16_4_ = local_300._16_4_ * 0.0;
    auVar260._20_4_ = local_300._20_4_ * 0.0;
    auVar260._28_36_ = auVar259._28_36_;
    auVar260._24_4_ = local_300._24_4_ * 0.0;
    auVar68._4_4_ = local_5e0._4_4_ * fVar115;
    auVar68._0_4_ = local_5e0._0_4_ * fVar116;
    auVar68._8_4_ = local_5e0._8_4_ * fVar140;
    auVar68._12_4_ = local_5e0._12_4_ * fVar139;
    auVar68._16_4_ = local_5e0._16_4_ * 0.0;
    auVar68._20_4_ = local_5e0._20_4_ * 0.0;
    auVar68._24_4_ = local_5e0._24_4_ * 0.0;
    auVar68._28_4_ = auVar95._28_4_;
    auVar66._8_8_ = uStack_1f8;
    auVar66._0_8_ = local_200;
    auVar66._16_8_ = uStack_1f0;
    auVar66._24_8_ = uStack_1e8;
    auVar259._0_4_ = (float)local_200 * fVar116;
    auVar259._4_4_ = (float)((ulong)local_200 >> 0x20) * fVar115;
    auVar259._8_4_ = (float)uStack_1f8 * fVar140;
    auVar259._12_4_ = (float)((ulong)uStack_1f8 >> 0x20) * fVar139;
    auVar259._16_4_ = (float)uStack_1f0 * 0.0;
    auVar259._20_4_ = (float)((ulong)uStack_1f0 >> 0x20) * 0.0;
    auVar259._28_36_ = auVar246._28_36_;
    auVar259._24_4_ = (float)uStack_1e8 * 0.0;
    auVar159._4_4_ = local_ae0._4_4_ * fVar115;
    auVar159._0_4_ = local_ae0._0_4_ * fVar116;
    auVar159._8_4_ = local_ae0._8_4_ * fVar140;
    auVar159._12_4_ = local_ae0._12_4_ * fVar139;
    auVar159._16_4_ = local_ae0._16_4_ * 0.0;
    auVar159._20_4_ = local_ae0._20_4_ * 0.0;
    auVar159._24_4_ = local_ae0._24_4_ * 0.0;
    auVar159._28_4_ = fVar142;
    auVar84 = vfmadd231ps_fma(auVar260._0_32_,auVar164,local_2e0);
    auVar83 = vfmadd231ps_fma(auVar68,auVar164,auVar263);
    auVar151 = vfmadd231ps_fma(auVar259._0_32_,auVar164,auVar274);
    auVar67._8_8_ = uStack_1d8;
    auVar67._0_8_ = local_1e0;
    auVar67._16_8_ = uStack_1d0;
    auVar67._24_8_ = uStack_1c8;
    auVar118 = vfmadd231ps_fma(auVar159,auVar164,auVar67);
    auVar12._4_4_ = local_320._4_4_ * fVar115;
    auVar12._0_4_ = local_320._0_4_ * fVar116;
    auVar12._8_4_ = local_320._8_4_ * fVar140;
    auVar12._12_4_ = local_320._12_4_ * fVar139;
    auVar12._16_4_ = local_320._16_4_ * 0.0;
    auVar12._20_4_ = local_320._20_4_ * 0.0;
    uVar80 = local_ae0._28_4_;
    auVar12._24_4_ = local_320._24_4_ * 0.0;
    auVar12._28_4_ = uVar80;
    auVar182._4_4_ = fVar115 * fStack_57c;
    auVar182._0_4_ = fVar116 * local_580;
    auVar182._8_4_ = fVar140 * fStack_578;
    auVar182._12_4_ = fVar139 * fStack_574;
    auVar182._16_4_ = fStack_570 * 0.0;
    auVar182._20_4_ = fStack_56c * 0.0;
    auVar182._24_4_ = fStack_568 * 0.0;
    auVar182._28_4_ = local_2e0._28_4_;
    auVar65._8_8_ = uStack_218;
    auVar65._0_8_ = local_220;
    auVar65._16_8_ = uStack_210;
    auVar65._24_8_ = uStack_208;
    auVar13._4_4_ = (float)((ulong)local_220 >> 0x20) * fVar115;
    auVar13._0_4_ = (float)local_220 * fVar116;
    auVar13._8_4_ = (float)uStack_218 * fVar140;
    auVar13._12_4_ = (float)((ulong)uStack_218 >> 0x20) * fVar139;
    auVar13._16_4_ = (float)uStack_210 * 0.0;
    auVar13._20_4_ = (float)((ulong)uStack_210 >> 0x20) * 0.0;
    auVar13._24_4_ = (float)uStack_208 * 0.0;
    auVar13._28_4_ = uVar80;
    auVar14._4_4_ = fVar115 * fStack_59c;
    auVar14._0_4_ = fVar116 * local_5a0;
    auVar14._8_4_ = fVar140 * fStack_598;
    auVar14._12_4_ = fVar139 * fStack_594;
    auVar14._16_4_ = fStack_590 * 0.0;
    auVar14._20_4_ = fStack_58c * 0.0;
    uVar23 = (undefined4)((ulong)uStack_1e8 >> 0x20);
    auVar14._24_4_ = fStack_588 * 0.0;
    auVar14._28_4_ = uVar23;
    auVar90 = vfmadd231ps_fma(auVar12,auVar164,local_300);
    auVar86 = vfmadd231ps_fma(auVar182,auVar164,local_5e0);
    auVar166 = vfmadd231ps_fma(auVar13,auVar164,auVar66);
    auVar193 = vfmadd231ps_fma(auVar14,auVar164,local_ae0);
    auVar206._4_4_ = fStack_33c * fVar115;
    auVar206._0_4_ = local_340 * fVar116;
    auVar206._8_4_ = fStack_338 * fVar140;
    auVar206._12_4_ = fStack_334 * fVar139;
    auVar206._16_4_ = fStack_330 * 0.0;
    auVar206._20_4_ = fStack_32c * 0.0;
    auVar206._24_4_ = fStack_328 * 0.0;
    auVar206._28_4_ = fStack_324;
    auVar15._4_4_ = fVar115 * local_240._4_4_;
    auVar15._0_4_ = fVar116 * (float)local_240;
    auVar15._8_4_ = fVar140 * (float)uStack_238;
    auVar15._12_4_ = fVar139 * uStack_238._4_4_;
    auVar15._16_4_ = (float)uStack_230 * 0.0;
    auVar15._20_4_ = uStack_230._4_4_ * 0.0;
    auVar15._24_4_ = (float)uStack_228 * 0.0;
    auVar15._28_4_ = uVar80;
    auVar16._28_4_ = local_300._28_4_;
    auVar16._0_28_ =
         ZEXT1628(CONCAT412(auVar90._12_4_ * fVar139,
                            CONCAT48(auVar90._8_4_ * fVar140,
                                     CONCAT44(auVar90._4_4_ * fVar115,auVar90._0_4_ * fVar116))));
    auVar84 = vfmadd231ps_fma(auVar16,auVar164,ZEXT1632(auVar84));
    auVar83 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar139 * auVar86._12_4_,
                                                 CONCAT48(fVar140 * auVar86._8_4_,
                                                          CONCAT44(fVar115 * auVar86._4_4_,
                                                                   fVar116 * auVar86._0_4_)))),
                              auVar164,ZEXT1632(auVar83));
    auVar151 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar139 * auVar166._12_4_,
                                                  CONCAT48(fVar140 * auVar166._8_4_,
                                                           CONCAT44(fVar115 * auVar166._4_4_,
                                                                    fVar116 * auVar166._0_4_)))),
                               auVar164,ZEXT1632(auVar151));
    auVar118 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar139 * auVar193._12_4_,
                                                  CONCAT48(fVar140 * auVar193._8_4_,
                                                           CONCAT44(fVar115 * auVar193._4_4_,
                                                                    fVar116 * auVar193._0_4_)))),
                               auVar164,ZEXT1632(auVar118));
    auVar181._4_4_ = fVar115 * local_260._4_4_;
    auVar181._0_4_ = fVar116 * (float)local_260;
    auVar181._8_4_ = fVar140 * (float)uStack_258;
    auVar181._12_4_ = fVar139 * uStack_258._4_4_;
    auVar181._16_4_ = (float)uStack_250 * 0.0;
    auVar181._20_4_ = uStack_250._4_4_ * 0.0;
    auVar181._24_4_ = (float)uStack_248 * 0.0;
    auVar181._28_4_ = local_5e0._28_4_;
    auVar82 = vfmadd231ps_fma(auVar206,auVar164,local_320);
    auVar90 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar82._12_4_ * fVar139,
                                                 CONCAT48(auVar82._8_4_ * fVar140,
                                                          CONCAT44(auVar82._4_4_ * fVar115,
                                                                   auVar82._0_4_ * fVar116)))),
                              auVar164,ZEXT1632(auVar90));
    auVar237._0_4_ = fVar116 * (float)local_280;
    auVar237._4_4_ = fVar115 * local_280._4_4_;
    auVar237._8_4_ = fVar140 * (float)uStack_278;
    auVar237._12_4_ = fVar139 * uStack_278._4_4_;
    auVar237._16_4_ = (float)uStack_270 * 0.0;
    auVar237._20_4_ = uStack_270._4_4_ * 0.0;
    auVar237._24_4_ = (float)uStack_268 * 0.0;
    auVar237._28_4_ = 0;
    auVar179._4_4_ = fStack_57c;
    auVar179._0_4_ = local_580;
    auVar179._8_4_ = fStack_578;
    auVar179._12_4_ = fStack_574;
    auVar179._16_4_ = fStack_570;
    auVar179._20_4_ = fStack_56c;
    auVar179._24_4_ = fStack_568;
    auVar179._28_4_ = fStack_564;
    auVar82 = vfmadd231ps_fma(auVar15,auVar164,auVar179);
    auVar117 = vfmadd231ps_fma(auVar181,auVar164,auVar65);
    auVar97._4_4_ = fStack_59c;
    auVar97._0_4_ = local_5a0;
    auVar97._8_4_ = fStack_598;
    auVar97._12_4_ = fStack_594;
    auVar97._16_4_ = fStack_590;
    auVar97._20_4_ = fStack_58c;
    auVar97._24_4_ = fStack_588;
    auVar97._28_4_ = fStack_584;
    auVar192 = vfmadd231ps_fma(auVar237,auVar164,auVar97);
    auVar17._28_4_ = (int)((ulong)uStack_208 >> 0x20);
    auVar17._0_28_ =
         ZEXT1628(CONCAT412(auVar192._12_4_ * fVar139,
                            CONCAT48(auVar192._8_4_ * fVar140,
                                     CONCAT44(auVar192._4_4_ * fVar115,auVar192._0_4_ * fVar116))));
    auVar86 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar82._12_4_ * fVar139,
                                                 CONCAT48(auVar82._8_4_ * fVar140,
                                                          CONCAT44(auVar82._4_4_ * fVar115,
                                                                   auVar82._0_4_ * fVar116)))),
                              auVar164,ZEXT1632(auVar86));
    auVar166 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar139 * auVar117._12_4_,
                                                  CONCAT48(fVar140 * auVar117._8_4_,
                                                           CONCAT44(fVar115 * auVar117._4_4_,
                                                                    fVar116 * auVar117._0_4_)))),
                               auVar164,ZEXT1632(auVar166));
    auVar193 = vfmadd231ps_fma(auVar17,auVar164,ZEXT1632(auVar193));
    auVar18._28_4_ = local_320._28_4_;
    auVar18._0_28_ =
         ZEXT1628(CONCAT412(auVar86._12_4_ * fVar139,
                            CONCAT48(auVar86._8_4_ * fVar140,
                                     CONCAT44(auVar86._4_4_ * fVar115,auVar86._0_4_ * fVar116))));
    auVar19._28_4_ = uVar23;
    auVar19._0_28_ =
         ZEXT1628(CONCAT412(fVar139 * auVar166._12_4_,
                            CONCAT48(fVar140 * auVar166._8_4_,
                                     CONCAT44(fVar115 * auVar166._4_4_,fVar116 * auVar166._0_4_))));
    auVar82 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar90._12_4_ * fVar139,
                                                 CONCAT48(auVar90._8_4_ * fVar140,
                                                          CONCAT44(auVar90._4_4_ * fVar115,
                                                                   auVar90._0_4_ * fVar116)))),
                              auVar164,ZEXT1632(auVar84));
    auVar117 = vfmadd231ps_fma(auVar18,auVar164,ZEXT1632(auVar83));
    auVar97 = ZEXT1632(auVar117);
    auVar117 = vfmadd231ps_fma(auVar19,auVar164,ZEXT1632(auVar151));
    auVar192 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar193._12_4_ * fVar139,
                                                  CONCAT48(auVar193._8_4_ * fVar140,
                                                           CONCAT44(auVar193._4_4_ * fVar115,
                                                                    auVar193._0_4_ * fVar116)))),
                               ZEXT1632(auVar118),auVar164);
    auVar164 = vsubps_avx(ZEXT1632(auVar90),ZEXT1632(auVar84));
    auVar95 = vsubps_avx(ZEXT1632(auVar86),ZEXT1632(auVar83));
    auVar96 = vsubps_avx(ZEXT1632(auVar166),ZEXT1632(auVar151));
    auVar159 = vsubps_avx(ZEXT1632(auVar193),ZEXT1632(auVar118));
    local_9a0._0_4_ = fVar149 * auVar164._0_4_ * 3.0;
    local_9a0._4_4_ = fVar149 * auVar164._4_4_ * 3.0;
    local_9a0._8_4_ = fVar149 * auVar164._8_4_ * 3.0;
    local_9a0._12_4_ = fVar149 * auVar164._12_4_ * 3.0;
    local_9a0._16_4_ = fVar149 * auVar164._16_4_ * 3.0;
    local_9a0._20_4_ = fVar149 * auVar164._20_4_ * 3.0;
    local_9a0._24_4_ = fVar149 * auVar164._24_4_ * 3.0;
    local_9a0._28_4_ = 0;
    local_9c0._0_4_ = fVar149 * auVar95._0_4_ * 3.0;
    local_9c0._4_4_ = fVar149 * auVar95._4_4_ * 3.0;
    local_9c0._8_4_ = fVar149 * auVar95._8_4_ * 3.0;
    local_9c0._12_4_ = fVar149 * auVar95._12_4_ * 3.0;
    local_9c0._16_4_ = fVar149 * auVar95._16_4_ * 3.0;
    local_9c0._20_4_ = fVar149 * auVar95._20_4_ * 3.0;
    local_9c0._24_4_ = fVar149 * auVar95._24_4_ * 3.0;
    local_9c0._28_4_ = 0;
    auVar244._0_4_ = fVar149 * auVar96._0_4_ * 3.0;
    auVar244._4_4_ = fVar149 * auVar96._4_4_ * 3.0;
    auVar244._8_4_ = fVar149 * auVar96._8_4_ * 3.0;
    auVar244._12_4_ = fVar149 * auVar96._12_4_ * 3.0;
    auVar244._16_4_ = fVar149 * auVar96._16_4_ * 3.0;
    auVar244._20_4_ = fVar149 * auVar96._20_4_ * 3.0;
    auVar244._24_4_ = fVar149 * auVar96._24_4_ * 3.0;
    auVar244._28_4_ = 0;
    fVar115 = fVar149 * auVar159._0_4_ * 3.0;
    fVar139 = fVar149 * auVar159._4_4_ * 3.0;
    auVar20._4_4_ = fVar139;
    auVar20._0_4_ = fVar115;
    fVar141 = fVar149 * auVar159._8_4_ * 3.0;
    auVar20._8_4_ = fVar141;
    fVar143 = fVar149 * auVar159._12_4_ * 3.0;
    auVar20._12_4_ = fVar143;
    fVar145 = fVar149 * auVar159._16_4_ * 3.0;
    auVar20._16_4_ = fVar145;
    fVar147 = fVar149 * auVar159._20_4_ * 3.0;
    auVar20._20_4_ = fVar147;
    fVar149 = fVar149 * auVar159._24_4_ * 3.0;
    auVar20._24_4_ = fVar149;
    auVar20._28_4_ = auVar164._28_4_;
    auVar179 = ZEXT1632(auVar82);
    auVar181 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar82));
    auVar17 = vpermps_avx2(_DAT_01fec480,auVar97);
    _local_a40 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar117));
    auVar12 = vsubps_avx(auVar181,auVar179);
    auVar182 = vsubps_avx(_local_a40,ZEXT1632(auVar117));
    fVar116 = auVar182._0_4_;
    fVar140 = auVar182._4_4_;
    auVar232._4_4_ = local_9a0._4_4_ * fVar140;
    auVar232._0_4_ = local_9a0._0_4_ * fVar116;
    fVar142 = auVar182._8_4_;
    auVar232._8_4_ = local_9a0._8_4_ * fVar142;
    fVar144 = auVar182._12_4_;
    auVar232._12_4_ = local_9a0._12_4_ * fVar144;
    fVar146 = auVar182._16_4_;
    auVar232._16_4_ = local_9a0._16_4_ * fVar146;
    fVar148 = auVar182._20_4_;
    auVar232._20_4_ = local_9a0._20_4_ * fVar148;
    fVar150 = auVar182._24_4_;
    auVar232._24_4_ = local_9a0._24_4_ * fVar150;
    auVar232._28_4_ = auVar181._28_4_;
    auVar84 = vfmsub231ps_fma(auVar232,auVar244,auVar12);
    auVar13 = vsubps_avx(auVar17,auVar97);
    fVar240 = auVar12._0_4_;
    fVar250 = auVar12._4_4_;
    auVar258._4_4_ = fVar250 * local_9c0._4_4_;
    auVar258._0_4_ = fVar240 * (float)local_9c0._0_4_;
    fVar251 = auVar12._8_4_;
    auVar258._8_4_ = fVar251 * local_9c0._8_4_;
    fVar252 = auVar12._12_4_;
    auVar258._12_4_ = fVar252 * local_9c0._12_4_;
    fVar253 = auVar12._16_4_;
    auVar258._16_4_ = fVar253 * local_9c0._16_4_;
    fVar254 = auVar12._20_4_;
    auVar258._20_4_ = fVar254 * local_9c0._20_4_;
    fVar255 = auVar12._24_4_;
    auVar258._24_4_ = fVar255 * local_9c0._24_4_;
    auVar258._28_4_ = auVar17._28_4_;
    auVar83 = vfmsub231ps_fma(auVar258,local_9a0,auVar13);
    auVar84 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar83._12_4_ * auVar83._12_4_,
                                                 CONCAT48(auVar83._8_4_ * auVar83._8_4_,
                                                          CONCAT44(auVar83._4_4_ * auVar83._4_4_,
                                                                   auVar83._0_4_ * auVar83._0_4_))))
                              ,ZEXT1632(auVar84),ZEXT1632(auVar84));
    fVar187 = auVar13._0_4_;
    fVar188 = auVar13._4_4_;
    auVar275._4_4_ = fVar188 * auVar244._4_4_;
    auVar275._0_4_ = fVar187 * auVar244._0_4_;
    fVar189 = auVar13._8_4_;
    auVar275._8_4_ = fVar189 * auVar244._8_4_;
    fVar190 = auVar13._12_4_;
    auVar275._12_4_ = fVar190 * auVar244._12_4_;
    fVar191 = auVar13._16_4_;
    auVar275._16_4_ = fVar191 * auVar244._16_4_;
    fVar261 = auVar13._20_4_;
    auVar275._20_4_ = fVar261 * auVar244._20_4_;
    fVar262 = auVar13._24_4_;
    auVar275._24_4_ = fVar262 * auVar244._24_4_;
    auVar275._28_4_ = local_a40._28_4_;
    auVar151 = vfmsub231ps_fma(auVar275,local_9c0,auVar182);
    auVar158._0_4_ = fVar116 * fVar116;
    auVar158._4_4_ = fVar140 * fVar140;
    auVar158._8_4_ = fVar142 * fVar142;
    auVar158._12_4_ = fVar144 * fVar144;
    auVar158._16_4_ = fVar146 * fVar146;
    auVar158._20_4_ = fVar148 * fVar148;
    auVar158._24_4_ = fVar150 * fVar150;
    auVar158._28_4_ = 0;
    auVar83 = vfmadd231ps_fma(auVar158,auVar13,auVar13);
    auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar12,auVar12);
    auVar95 = vrcpps_avx(ZEXT1632(auVar83));
    auVar151 = vfmadd231ps_fma(ZEXT1632(auVar84),ZEXT1632(auVar151),ZEXT1632(auVar151));
    auVar268._8_4_ = 0x3f800000;
    auVar268._0_8_ = 0x3f8000003f800000;
    auVar268._12_4_ = 0x3f800000;
    auVar268._16_4_ = 0x3f800000;
    auVar268._20_4_ = 0x3f800000;
    auVar268._24_4_ = 0x3f800000;
    auVar268._28_4_ = 0x3f800000;
    auVar84 = vfnmadd213ps_fma(auVar95,ZEXT1632(auVar83),auVar268);
    auVar84 = vfmadd132ps_fma(ZEXT1632(auVar84),auVar95,auVar95);
    auVar18 = vpermps_avx2(_DAT_01fec480,local_9a0);
    local_a60 = vpermps_avx2(_DAT_01fec480,auVar244);
    auVar277._4_4_ = auVar18._4_4_ * fVar140;
    auVar277._0_4_ = auVar18._0_4_ * fVar116;
    auVar277._8_4_ = auVar18._8_4_ * fVar142;
    auVar277._12_4_ = auVar18._12_4_ * fVar144;
    auVar277._16_4_ = auVar18._16_4_ * fVar146;
    auVar277._20_4_ = auVar18._20_4_ * fVar148;
    auVar277._24_4_ = auVar18._24_4_ * fVar150;
    auVar277._28_4_ = auVar95._28_4_;
    auVar118 = vfmsub231ps_fma(auVar277,local_a60,auVar12);
    local_a80 = vpermps_avx2(_DAT_01fec480,local_9c0);
    auVar10._4_4_ = fVar250 * local_a80._4_4_;
    auVar10._0_4_ = fVar240 * local_a80._0_4_;
    auVar10._8_4_ = fVar251 * local_a80._8_4_;
    auVar10._12_4_ = fVar252 * local_a80._12_4_;
    auVar10._16_4_ = fVar253 * local_a80._16_4_;
    auVar10._20_4_ = fVar254 * local_a80._20_4_;
    auVar10._24_4_ = fVar255 * local_a80._24_4_;
    auVar10._28_4_ = 0;
    auVar90 = vfmsub231ps_fma(auVar10,auVar18,auVar13);
    auVar118 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar90._12_4_ * auVar90._12_4_,
                                                  CONCAT48(auVar90._8_4_ * auVar90._8_4_,
                                                           CONCAT44(auVar90._4_4_ * auVar90._4_4_,
                                                                    auVar90._0_4_ * auVar90._0_4_)))
                                       ),ZEXT1632(auVar118),ZEXT1632(auVar118));
    auVar219._0_4_ = fVar187 * local_a60._0_4_;
    auVar219._4_4_ = fVar188 * local_a60._4_4_;
    auVar219._8_4_ = fVar189 * local_a60._8_4_;
    auVar219._12_4_ = fVar190 * local_a60._12_4_;
    auVar219._16_4_ = fVar191 * local_a60._16_4_;
    auVar219._20_4_ = fVar261 * local_a60._20_4_;
    auVar219._24_4_ = fVar262 * local_a60._24_4_;
    auVar219._28_4_ = 0;
    auVar90 = vfmsub231ps_fma(auVar219,local_a80,auVar182);
    auVar118 = vfmadd231ps_fma(ZEXT1632(auVar118),ZEXT1632(auVar90),ZEXT1632(auVar90));
    auVar95 = vmaxps_avx(ZEXT1632(CONCAT412(auVar151._12_4_ * auVar84._12_4_,
                                            CONCAT48(auVar151._8_4_ * auVar84._8_4_,
                                                     CONCAT44(auVar151._4_4_ * auVar84._4_4_,
                                                              auVar151._0_4_ * auVar84._0_4_)))),
                         ZEXT1632(CONCAT412(auVar118._12_4_ * auVar84._12_4_,
                                            CONCAT48(auVar118._8_4_ * auVar84._8_4_,
                                                     CONCAT44(auVar118._4_4_ * auVar84._4_4_,
                                                              auVar118._0_4_ * auVar84._0_4_)))));
    auVar180._0_4_ = auVar192._0_4_ + fVar115;
    auVar180._4_4_ = auVar192._4_4_ + fVar139;
    auVar180._8_4_ = auVar192._8_4_ + fVar141;
    auVar180._12_4_ = auVar192._12_4_ + fVar143;
    auVar180._16_4_ = fVar145 + 0.0;
    auVar180._20_4_ = fVar147 + 0.0;
    auVar180._24_4_ = fVar149 + 0.0;
    auVar180._28_4_ = auVar164._28_4_ + 0.0;
    auStack_850 = auVar180._16_16_;
    local_840 = ZEXT1632(auVar192);
    auVar164 = vsubps_avx(local_840,auVar20);
    auVar19 = vpermps_avx2(_DAT_01fec480,auVar164);
    auVar20 = vpermps_avx2(_DAT_01fec480,local_840);
    auVar164 = vmaxps_avx(local_840,auVar180);
    auVar96 = vmaxps_avx(auVar19,auVar20);
    auVar159 = vrsqrtps_avx(ZEXT1632(auVar83));
    auVar164 = vmaxps_avx(auVar164,auVar96);
    fVar115 = auVar159._0_4_;
    fVar139 = auVar159._4_4_;
    fVar149 = auVar159._8_4_;
    fVar141 = auVar159._12_4_;
    fVar143 = auVar159._16_4_;
    fVar145 = auVar159._20_4_;
    fVar147 = auVar159._24_4_;
    auVar11._4_4_ = fVar139 * fVar139 * fVar139 * auVar83._4_4_ * -0.5;
    auVar11._0_4_ = fVar115 * fVar115 * fVar115 * auVar83._0_4_ * -0.5;
    auVar11._8_4_ = fVar149 * fVar149 * fVar149 * auVar83._8_4_ * -0.5;
    auVar11._12_4_ = fVar141 * fVar141 * fVar141 * auVar83._12_4_ * -0.5;
    auVar11._16_4_ = fVar143 * fVar143 * fVar143 * -0.0;
    auVar11._20_4_ = fVar145 * fVar145 * fVar145 * -0.0;
    auVar11._24_4_ = fVar147 * fVar147 * fVar147 * -0.0;
    auVar11._28_4_ = local_a80._28_4_;
    auVar98._8_4_ = 0x3fc00000;
    auVar98._0_8_ = 0x3fc000003fc00000;
    auVar98._12_4_ = 0x3fc00000;
    auVar98._16_4_ = 0x3fc00000;
    auVar98._20_4_ = 0x3fc00000;
    auVar98._24_4_ = 0x3fc00000;
    auVar98._28_4_ = 0x3fc00000;
    auVar84 = vfmadd231ps_fma(auVar11,auVar98,auVar159);
    fVar115 = auVar84._0_4_;
    fVar139 = auVar84._4_4_;
    auVar24._4_4_ = fVar188 * fVar139;
    auVar24._0_4_ = fVar187 * fVar115;
    fVar149 = auVar84._8_4_;
    auVar24._8_4_ = fVar189 * fVar149;
    fVar141 = auVar84._12_4_;
    auVar24._12_4_ = fVar190 * fVar141;
    auVar24._16_4_ = fVar191 * 0.0;
    auVar24._20_4_ = fVar261 * 0.0;
    uVar23 = auVar159._28_4_;
    auVar24._24_4_ = fVar262 * 0.0;
    auVar24._28_4_ = uVar23;
    auVar25._4_4_ = (float)local_a00._4_4_ * fVar139 * fVar140;
    auVar25._0_4_ = (float)local_a00._0_4_ * fVar115 * fVar116;
    auVar25._8_4_ = fStack_9f8 * fVar149 * fVar142;
    auVar25._12_4_ = fStack_9f4 * fVar141 * fVar144;
    auVar25._16_4_ = fStack_9f0 * fVar146 * 0.0;
    auVar25._20_4_ = fStack_9ec * fVar148 * 0.0;
    auVar25._24_4_ = fStack_9e8 * fVar150 * 0.0;
    auVar25._28_4_ = auVar13._28_4_;
    auVar83 = vfmadd231ps_fma(auVar25,auVar24,_local_ac0);
    auVar275 = ZEXT1632(auVar117);
    auVar159 = vsubps_avx(ZEXT832(0) << 0x20,auVar275);
    fVar145 = auVar159._0_4_;
    auVar276._0_4_ = fVar145 * fVar115 * fVar116;
    fVar147 = auVar159._4_4_;
    auVar276._4_4_ = fVar147 * fVar139 * fVar140;
    fVar187 = auVar159._8_4_;
    auVar276._8_4_ = fVar187 * fVar149 * fVar142;
    fVar188 = auVar159._12_4_;
    auVar276._12_4_ = fVar188 * fVar141 * fVar144;
    fVar189 = auVar159._16_4_;
    auVar276._16_4_ = fVar189 * fVar146 * 0.0;
    fVar190 = auVar159._20_4_;
    auVar276._20_4_ = fVar190 * fVar148 * 0.0;
    fVar191 = auVar159._24_4_;
    auVar276._24_4_ = fVar191 * fVar150 * 0.0;
    auVar276._28_4_ = 0;
    auVar14 = vsubps_avx(ZEXT832(0) << 0x20,auVar97);
    auVar151 = vfmadd231ps_fma(auVar276,auVar14,auVar24);
    auVar26._4_4_ = fVar250 * fVar139;
    auVar26._0_4_ = fVar240 * fVar115;
    auVar26._8_4_ = fVar251 * fVar149;
    auVar26._12_4_ = fVar252 * fVar141;
    auVar26._16_4_ = fVar253 * 0.0;
    auVar26._20_4_ = fVar254 * 0.0;
    auVar26._24_4_ = fVar255 * 0.0;
    auVar26._28_4_ = uVar23;
    auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar26,_local_880);
    auVar259 = ZEXT1664(auVar83);
    auVar232 = ZEXT832(0) << 0x20;
    auVar206 = vsubps_avx(auVar232,auVar179);
    auVar151 = vfmadd231ps_fma(ZEXT1632(auVar151),auVar206,auVar26);
    auVar27._4_4_ = (float)local_a00._4_4_ * fVar147;
    auVar27._0_4_ = (float)local_a00._0_4_ * fVar145;
    auVar27._8_4_ = fStack_9f8 * fVar187;
    auVar27._12_4_ = fStack_9f4 * fVar188;
    auVar27._16_4_ = fStack_9f0 * fVar189;
    auVar27._20_4_ = fStack_9ec * fVar190;
    auVar27._24_4_ = fStack_9e8 * fVar191;
    auVar27._28_4_ = uVar23;
    auVar118 = vfmadd231ps_fma(auVar27,_local_ac0,auVar14);
    auVar118 = vfmadd231ps_fma(ZEXT1632(auVar118),_local_880,auVar206);
    fVar116 = auVar151._0_4_;
    fVar240 = auVar83._0_4_;
    fVar140 = auVar151._4_4_;
    fVar250 = auVar83._4_4_;
    fVar142 = auVar151._8_4_;
    fVar251 = auVar83._8_4_;
    fVar144 = auVar151._12_4_;
    fVar252 = auVar83._12_4_;
    auVar28._28_4_ = local_880._28_4_;
    auVar28._0_28_ =
         ZEXT1628(CONCAT412(fVar252 * fVar144,
                            CONCAT48(fVar251 * fVar142,CONCAT44(fVar250 * fVar140,fVar240 * fVar116)
                                    )));
    auVar15 = vsubps_avx(ZEXT1632(auVar118),auVar28);
    auVar29._4_4_ = fVar147 * fVar147;
    auVar29._0_4_ = fVar145 * fVar145;
    auVar29._8_4_ = fVar187 * fVar187;
    auVar29._12_4_ = fVar188 * fVar188;
    auVar29._16_4_ = fVar189 * fVar189;
    auVar29._20_4_ = fVar190 * fVar190;
    auVar29._24_4_ = fVar191 * fVar191;
    auVar29._28_4_ = local_880._28_4_;
    auVar118 = vfmadd231ps_fma(auVar29,auVar14,auVar14);
    auVar118 = vfmadd231ps_fma(ZEXT1632(auVar118),auVar206,auVar206);
    auVar30._28_4_ = auVar12._28_4_;
    auVar30._0_28_ =
         ZEXT1628(CONCAT412(fVar144 * fVar144,
                            CONCAT48(fVar142 * fVar142,CONCAT44(fVar140 * fVar140,fVar116 * fVar116)
                                    )));
    auVar16 = vsubps_avx(ZEXT1632(auVar118),auVar30);
    auVar96 = vsqrtps_avx(auVar95);
    fVar143 = auVar96._28_4_ + auVar164._28_4_;
    fVar116 = (auVar96._0_4_ + auVar164._0_4_) * 1.0000002;
    fVar140 = (auVar96._4_4_ + auVar164._4_4_) * 1.0000002;
    fVar142 = (auVar96._8_4_ + auVar164._8_4_) * 1.0000002;
    fVar144 = (auVar96._12_4_ + auVar164._12_4_) * 1.0000002;
    fVar146 = (auVar96._16_4_ + auVar164._16_4_) * 1.0000002;
    fVar148 = (auVar96._20_4_ + auVar164._20_4_) * 1.0000002;
    fVar150 = (auVar96._24_4_ + auVar164._24_4_) * 1.0000002;
    auVar31._4_4_ = fVar140 * fVar140;
    auVar31._0_4_ = fVar116 * fVar116;
    auVar31._8_4_ = fVar142 * fVar142;
    auVar31._12_4_ = fVar144 * fVar144;
    auVar31._16_4_ = fVar146 * fVar146;
    auVar31._20_4_ = fVar148 * fVar148;
    auVar31._24_4_ = fVar150 * fVar150;
    auVar31._28_4_ = fVar143;
    local_2c0._0_4_ = auVar15._0_4_ + auVar15._0_4_;
    local_2c0._4_4_ = auVar15._4_4_ + auVar15._4_4_;
    local_2c0._8_4_ = auVar15._8_4_ + auVar15._8_4_;
    local_2c0._12_4_ = auVar15._12_4_ + auVar15._12_4_;
    local_2c0._16_4_ = auVar15._16_4_ + auVar15._16_4_;
    local_2c0._20_4_ = auVar15._20_4_ + auVar15._20_4_;
    local_2c0._24_4_ = auVar15._24_4_ + auVar15._24_4_;
    fVar116 = auVar15._28_4_;
    local_2c0._28_4_ = fVar116 + fVar116;
    auVar164 = vsubps_avx(auVar16,auVar31);
    auVar258 = ZEXT1632(auVar83);
    local_9e0._28_4_ = fVar116;
    local_9e0._0_28_ =
         ZEXT1628(CONCAT412(fVar252 * fVar252,
                            CONCAT48(fVar251 * fVar251,CONCAT44(fVar250 * fVar250,fVar240 * fVar240)
                                    )));
    local_660 = vsubps_avx(local_2a0,local_9e0);
    auVar32._4_4_ = local_2c0._4_4_ * local_2c0._4_4_;
    auVar32._0_4_ = local_2c0._0_4_ * local_2c0._0_4_;
    auVar32._8_4_ = local_2c0._8_4_ * local_2c0._8_4_;
    auVar32._12_4_ = local_2c0._12_4_ * local_2c0._12_4_;
    auVar32._16_4_ = local_2c0._16_4_ * local_2c0._16_4_;
    auVar32._20_4_ = local_2c0._20_4_ * local_2c0._20_4_;
    auVar32._24_4_ = local_2c0._24_4_ * local_2c0._24_4_;
    auVar32._28_4_ = auVar95._28_4_;
    fVar140 = local_660._0_4_;
    fVar142 = local_660._4_4_;
    fVar144 = local_660._8_4_;
    fVar146 = local_660._12_4_;
    fVar148 = local_660._16_4_;
    fVar150 = local_660._20_4_;
    fVar240 = local_660._24_4_;
    auVar33._4_4_ = auVar164._4_4_ * fVar142 * 4.0;
    auVar33._0_4_ = auVar164._0_4_ * fVar140 * 4.0;
    auVar33._8_4_ = auVar164._8_4_ * fVar144 * 4.0;
    auVar33._12_4_ = auVar164._12_4_ * fVar146 * 4.0;
    auVar33._16_4_ = auVar164._16_4_ * fVar148 * 4.0;
    auVar33._20_4_ = auVar164._20_4_ * fVar150 * 4.0;
    auVar33._24_4_ = auVar164._24_4_ * fVar240 * 4.0;
    auVar33._28_4_ = fVar143;
    auVar15 = vsubps_avx(auVar32,auVar33);
    auVar95 = vcmpps_avx(auVar15,auVar232,5);
    auVar277 = ZEXT1632(auVar151);
    fVar116 = local_660._28_4_;
    if ((((((((auVar95 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar95 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar95 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar95 >> 0x7f,0) == '\0') &&
          (auVar95 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar95 >> 0xbf,0) == '\0') &&
        (auVar95 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar95[0x1f]) {
      auVar245._8_4_ = 0x7f800000;
      auVar245._0_8_ = 0x7f8000007f800000;
      auVar245._12_4_ = 0x7f800000;
      auVar245._16_4_ = 0x7f800000;
      auVar245._20_4_ = 0x7f800000;
      auVar245._24_4_ = 0x7f800000;
      auVar245._28_4_ = 0x7f800000;
      auVar202._8_4_ = 0xff800000;
      auVar202._0_8_ = 0xff800000ff800000;
      auVar202._12_4_ = 0xff800000;
      auVar202._16_4_ = 0xff800000;
      auVar202._20_4_ = 0xff800000;
      auVar202._24_4_ = 0xff800000;
      auVar202._28_4_ = 0xff800000;
    }
    else {
      auVar11 = vsqrtps_avx(auVar15);
      auVar99._0_4_ = fVar140 + fVar140;
      auVar99._4_4_ = fVar142 + fVar142;
      auVar99._8_4_ = fVar144 + fVar144;
      auVar99._12_4_ = fVar146 + fVar146;
      auVar99._16_4_ = fVar148 + fVar148;
      auVar99._20_4_ = fVar150 + fVar150;
      auVar99._24_4_ = fVar240 + fVar240;
      auVar99._28_4_ = fVar116 + fVar116;
      auVar10 = vrcpps_avx(auVar99);
      auVar232 = vcmpps_avx(auVar15,auVar232,5);
      auVar203._8_4_ = 0x3f800000;
      auVar203._0_8_ = 0x3f8000003f800000;
      auVar203._12_4_ = 0x3f800000;
      auVar203._16_4_ = 0x3f800000;
      auVar203._20_4_ = 0x3f800000;
      auVar203._24_4_ = 0x3f800000;
      auVar203._28_4_ = 0x3f800000;
      auVar83 = vfnmadd213ps_fma(auVar99,auVar10,auVar203);
      auVar83 = vfmadd132ps_fma(ZEXT1632(auVar83),auVar10,auVar10);
      auVar204._0_4_ = (uint)local_2c0._0_4_ ^ local_7c0;
      auVar204._4_4_ = (uint)local_2c0._4_4_ ^ uStack_7bc;
      auVar204._8_4_ = (uint)local_2c0._8_4_ ^ uStack_7b8;
      auVar204._12_4_ = (uint)local_2c0._12_4_ ^ uStack_7b4;
      auVar204._16_4_ = (uint)local_2c0._16_4_ ^ (uint)fStack_7b0;
      auVar204._20_4_ = (uint)local_2c0._20_4_ ^ (uint)fStack_7ac;
      auVar204._24_4_ = (uint)local_2c0._24_4_ ^ (uint)fStack_7a8;
      auVar204._28_4_ = (uint)local_2c0._28_4_ ^ uStack_7a4;
      auVar10 = vsubps_avx(auVar204,auVar11);
      auVar34._4_4_ = auVar10._4_4_ * auVar83._4_4_;
      auVar34._0_4_ = auVar10._0_4_ * auVar83._0_4_;
      auVar34._8_4_ = auVar10._8_4_ * auVar83._8_4_;
      auVar34._12_4_ = auVar10._12_4_ * auVar83._12_4_;
      auVar34._16_4_ = auVar10._16_4_ * 0.0;
      auVar34._20_4_ = auVar10._20_4_ * 0.0;
      auVar34._24_4_ = auVar10._24_4_ * 0.0;
      auVar34._28_4_ = auVar10._28_4_;
      auVar15 = vsubps_avx(auVar11,local_2c0);
      auVar100._0_4_ = auVar15._0_4_ * auVar83._0_4_;
      auVar100._4_4_ = auVar15._4_4_ * auVar83._4_4_;
      auVar100._8_4_ = auVar15._8_4_ * auVar83._8_4_;
      auVar100._12_4_ = auVar15._12_4_ * auVar83._12_4_;
      auVar100._16_4_ = auVar15._16_4_ * 0.0;
      auVar100._20_4_ = auVar15._20_4_ * 0.0;
      auVar100._24_4_ = auVar15._24_4_ * 0.0;
      auVar100._28_4_ = 0;
      auVar83 = vfmadd213ps_fma(auVar258,auVar34,auVar277);
      local_380 = ZEXT1632(CONCAT412(fVar141 * auVar83._12_4_,
                                     CONCAT48(fVar149 * auVar83._8_4_,
                                              CONCAT44(fVar139 * auVar83._4_4_,
                                                       fVar115 * auVar83._0_4_))));
      auVar58._4_4_ = uStack_89c;
      auVar58._0_4_ = local_8a0;
      auVar58._8_4_ = uStack_898;
      auVar58._12_4_ = uStack_894;
      auVar58._16_4_ = uStack_890;
      auVar58._20_4_ = uStack_88c;
      auVar58._24_4_ = uStack_888;
      auVar58._28_4_ = uStack_884;
      auVar15 = vandps_avx(local_9e0,auVar58);
      auVar15 = vmaxps_avx(local_600,auVar15);
      auVar35._4_4_ = auVar15._4_4_ * 1.9073486e-06;
      auVar35._0_4_ = auVar15._0_4_ * 1.9073486e-06;
      auVar35._8_4_ = auVar15._8_4_ * 1.9073486e-06;
      auVar35._12_4_ = auVar15._12_4_ * 1.9073486e-06;
      auVar35._16_4_ = auVar15._16_4_ * 1.9073486e-06;
      auVar35._20_4_ = auVar15._20_4_ * 1.9073486e-06;
      auVar35._24_4_ = auVar15._24_4_ * 1.9073486e-06;
      auVar35._28_4_ = auVar15._28_4_;
      auVar15 = vandps_avx(local_660,auVar58);
      auVar15 = vcmpps_avx(auVar15,auVar35,1);
      auVar83 = vfmadd213ps_fma(auVar258,auVar100,auVar277);
      auVar233._8_4_ = 0x7f800000;
      auVar233._0_8_ = 0x7f8000007f800000;
      auVar233._12_4_ = 0x7f800000;
      auVar233._16_4_ = 0x7f800000;
      auVar233._20_4_ = 0x7f800000;
      auVar233._24_4_ = 0x7f800000;
      auVar233._28_4_ = 0x7f800000;
      auVar245 = vblendvps_avx(auVar233,auVar34,auVar232);
      local_3a0 = fVar115 * auVar83._0_4_;
      fStack_39c = fVar139 * auVar83._4_4_;
      fStack_398 = fVar149 * auVar83._8_4_;
      fStack_394 = fVar141 * auVar83._12_4_;
      uStack_390 = 0;
      uStack_38c = 0;
      uStack_388 = 0;
      uStack_384 = auVar10._28_4_;
      auVar205._8_4_ = 0xff800000;
      auVar205._0_8_ = 0xff800000ff800000;
      auVar205._12_4_ = 0xff800000;
      auVar205._16_4_ = 0xff800000;
      auVar205._20_4_ = 0xff800000;
      auVar205._24_4_ = 0xff800000;
      auVar205._28_4_ = 0xff800000;
      auVar202 = vblendvps_avx(auVar205,auVar100,auVar232);
      auVar10 = auVar232 & auVar15;
      if ((((((((auVar10 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar10 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar10 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar10 >> 0x7f,0) != '\0') ||
            (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar10 >> 0xbf,0) != '\0') ||
          (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar10[0x1f] < '\0') {
        auVar95 = vandps_avx(auVar15,auVar232);
        auVar15 = vcmpps_avx(auVar164,_DAT_01faff00,2);
        auVar234._8_4_ = 0xff800000;
        auVar234._0_8_ = 0xff800000ff800000;
        auVar234._12_4_ = 0xff800000;
        auVar234._16_4_ = 0xff800000;
        auVar234._20_4_ = 0xff800000;
        auVar234._24_4_ = 0xff800000;
        auVar234._28_4_ = 0xff800000;
        auVar273._8_4_ = 0x7f800000;
        auVar273._0_8_ = 0x7f8000007f800000;
        auVar273._12_4_ = 0x7f800000;
        auVar273._16_4_ = 0x7f800000;
        auVar273._20_4_ = 0x7f800000;
        auVar273._24_4_ = 0x7f800000;
        auVar273._28_4_ = 0x7f800000;
        auVar164 = vblendvps_avx(auVar273,auVar234,auVar15);
        auVar83 = vpackssdw_avx(auVar95._0_16_,auVar95._16_16_);
        auVar10 = vpmovsxwd_avx2(auVar83);
        auVar245 = vblendvps_avx(auVar245,auVar164,auVar10);
        auVar164 = vblendvps_avx(auVar234,auVar273,auVar15);
        auVar202 = vblendvps_avx(auVar202,auVar164,auVar10);
        auVar110._0_8_ = auVar95._0_8_ ^ 0xffffffffffffffff;
        auVar110._8_4_ = auVar95._8_4_ ^ 0xffffffff;
        auVar110._12_4_ = auVar95._12_4_ ^ 0xffffffff;
        auVar110._16_4_ = auVar95._16_4_ ^ 0xffffffff;
        auVar110._20_4_ = auVar95._20_4_ ^ 0xffffffff;
        auVar110._24_4_ = auVar95._24_4_ ^ 0xffffffff;
        auVar110._28_4_ = auVar95._28_4_ ^ 0xffffffff;
        auVar95 = vorps_avx(auVar15,auVar110);
        auVar95 = vandps_avx(auVar232,auVar95);
      }
    }
    auVar164 = local_5c0 & auVar95;
    if ((((((((auVar164 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar164 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar164 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar164 >> 0x7f,0) != '\0') ||
          (auVar164 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar164 >> 0xbf,0) != '\0') ||
        (auVar164 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar164[0x1f] < '\0') {
      local_3c0 = ZEXT1632(auVar84);
      fVar143 = *(float *)(ray + k * 4 + 0x100);
      local_6b0 = ZEXT416((uint)fVar143);
      fVar250 = fVar143 - (float)local_920._0_4_;
      auVar101._4_4_ = fVar250;
      auVar101._0_4_ = fVar250;
      auVar101._8_4_ = fVar250;
      auVar101._12_4_ = fVar250;
      auVar101._16_4_ = fVar250;
      auVar101._20_4_ = fVar250;
      auVar101._24_4_ = fVar250;
      auVar101._28_4_ = fVar250;
      auVar15 = vminps_avx(auVar101,auVar202);
      auVar36._4_4_ = fVar147 * auVar244._4_4_;
      auVar36._0_4_ = fVar145 * auVar244._0_4_;
      auVar36._8_4_ = fVar187 * auVar244._8_4_;
      auVar36._12_4_ = fVar188 * auVar244._12_4_;
      auVar36._16_4_ = fVar189 * auVar244._16_4_;
      auVar36._20_4_ = fVar190 * auVar244._20_4_;
      auVar36._24_4_ = fVar191 * auVar244._24_4_;
      auVar36._28_4_ = auVar159._28_4_;
      auVar84 = vfmadd213ps_fma(auVar14,local_9c0,auVar36);
      auVar64._4_4_ = fStack_35c;
      auVar64._0_4_ = local_360;
      auVar64._8_4_ = fStack_358;
      auVar64._12_4_ = fStack_354;
      auVar64._16_4_ = fStack_350;
      auVar64._20_4_ = fStack_34c;
      auVar64._24_4_ = fStack_348;
      auVar64._28_4_ = fStack_344;
      auVar14 = vmaxps_avx(auVar64,auVar245);
      auVar83 = vfmadd213ps_fma(auVar206,local_9a0,ZEXT1632(auVar84));
      auVar37._4_4_ = (float)local_a00._4_4_ * auVar244._4_4_;
      auVar37._0_4_ = (float)local_a00._0_4_ * auVar244._0_4_;
      auVar37._8_4_ = fStack_9f8 * auVar244._8_4_;
      auVar37._12_4_ = fStack_9f4 * auVar244._12_4_;
      auVar37._16_4_ = fStack_9f0 * auVar244._16_4_;
      auVar37._20_4_ = fStack_9ec * auVar244._20_4_;
      auVar37._24_4_ = fStack_9e8 * auVar244._24_4_;
      auVar37._28_4_ = 0;
      auVar84 = vfmadd231ps_fma(auVar37,_local_ac0,local_9c0);
      auVar151 = vfmadd231ps_fma(ZEXT1632(auVar84),_local_880,local_9a0);
      auVar59._4_4_ = uStack_89c;
      auVar59._0_4_ = local_8a0;
      auVar59._8_4_ = uStack_898;
      auVar59._12_4_ = uStack_894;
      auVar59._16_4_ = uStack_890;
      auVar59._20_4_ = uStack_88c;
      auVar59._24_4_ = uStack_888;
      auVar59._28_4_ = uStack_884;
      auVar164 = vandps_avx(auVar59,ZEXT1632(auVar151));
      auVar102._8_4_ = 0x219392ef;
      auVar102._0_8_ = 0x219392ef219392ef;
      auVar102._12_4_ = 0x219392ef;
      auVar102._16_4_ = 0x219392ef;
      auVar102._20_4_ = 0x219392ef;
      auVar102._24_4_ = 0x219392ef;
      auVar102._28_4_ = 0x219392ef;
      auVar159 = vcmpps_avx(auVar164,auVar102,1);
      auVar164 = vrcpps_avx(ZEXT1632(auVar151));
      auVar269._8_4_ = 0x3f800000;
      auVar269._0_8_ = 0x3f8000003f800000;
      auVar269._12_4_ = 0x3f800000;
      auVar269._16_4_ = 0x3f800000;
      auVar269._20_4_ = 0x3f800000;
      auVar269._24_4_ = 0x3f800000;
      auVar269._28_4_ = 0x3f800000;
      auVar206 = ZEXT1632(auVar151);
      auVar84 = vfnmadd213ps_fma(auVar164,auVar206,auVar269);
      auVar84 = vfmadd132ps_fma(ZEXT1632(auVar84),auVar164,auVar164);
      auVar264._0_4_ = auVar151._0_4_ ^ local_7c0;
      auVar264._4_4_ = auVar151._4_4_ ^ uStack_7bc;
      auVar264._8_4_ = auVar151._8_4_ ^ uStack_7b8;
      auVar264._12_4_ = auVar151._12_4_ ^ uStack_7b4;
      auVar264._16_4_ = fStack_7b0;
      auVar264._20_4_ = fStack_7ac;
      auVar264._24_4_ = fStack_7a8;
      auVar264._28_4_ = uStack_7a4;
      auVar38._4_4_ = auVar84._4_4_ * (float)(auVar83._4_4_ ^ uStack_7bc);
      auVar38._0_4_ = auVar84._0_4_ * (float)(auVar83._0_4_ ^ local_7c0);
      auVar38._8_4_ = auVar84._8_4_ * (float)(auVar83._8_4_ ^ uStack_7b8);
      auVar38._12_4_ = auVar84._12_4_ * (float)(auVar83._12_4_ ^ uStack_7b4);
      auVar38._16_4_ = fStack_7b0 * 0.0;
      auVar38._20_4_ = fStack_7ac * 0.0;
      auVar38._24_4_ = fStack_7a8 * 0.0;
      auVar38._28_4_ = uStack_7a4;
      auVar164 = vcmpps_avx(auVar206,auVar264,1);
      auVar164 = vorps_avx(auVar159,auVar164);
      auVar270._8_4_ = 0xff800000;
      auVar270._0_8_ = 0xff800000ff800000;
      auVar270._12_4_ = 0xff800000;
      auVar270._16_4_ = 0xff800000;
      auVar270._20_4_ = 0xff800000;
      auVar270._24_4_ = 0xff800000;
      auVar270._28_4_ = 0xff800000;
      auVar164 = vblendvps_avx(auVar38,auVar270,auVar164);
      auVar14 = vmaxps_avx(auVar14,auVar164);
      auVar164 = vcmpps_avx(auVar206,auVar264,6);
      auVar164 = vorps_avx(auVar159,auVar164);
      auVar207._8_4_ = 0x7f800000;
      auVar207._0_8_ = 0x7f8000007f800000;
      auVar207._12_4_ = 0x7f800000;
      auVar207._16_4_ = 0x7f800000;
      auVar207._20_4_ = 0x7f800000;
      auVar207._24_4_ = 0x7f800000;
      auVar207._28_4_ = 0x7f800000;
      auVar164 = vblendvps_avx(auVar38,auVar207,auVar164);
      auVar206 = vminps_avx(auVar15,auVar164);
      fVar145 = (float)(local_7c0 ^ (uint)local_a60._0_4_);
      fVar147 = (float)(uStack_7bc ^ (uint)local_a60._4_4_);
      fVar187 = (float)(uStack_7b8 ^ (uint)local_a60._8_4_);
      fVar188 = (float)(uStack_7b4 ^ (uint)local_a60._12_4_);
      fVar189 = (float)((uint)fStack_7b0 ^ (uint)local_a60._16_4_);
      fVar190 = (float)((uint)fStack_7ac ^ (uint)local_a60._20_4_);
      fVar191 = (float)((uint)fStack_7a8 ^ (uint)local_a60._24_4_);
      auVar208._0_4_ = local_7c0 ^ (uint)local_a80._0_4_;
      auVar208._4_4_ = uStack_7bc ^ (uint)local_a80._4_4_;
      auVar208._8_4_ = uStack_7b8 ^ (uint)local_a80._8_4_;
      auVar208._12_4_ = uStack_7b4 ^ (uint)local_a80._12_4_;
      auVar208._16_4_ = (uint)fStack_7b0 ^ (uint)local_a80._16_4_;
      auVar208._20_4_ = (uint)fStack_7ac ^ (uint)local_a80._20_4_;
      auVar208._24_4_ = (uint)fStack_7a8 ^ (uint)local_a80._24_4_;
      auVar208._28_4_ = uStack_7a4 ^ local_a80._28_4_;
      auVar164 = vsubps_avx(ZEXT832(0) << 0x20,auVar17);
      auVar159 = vsubps_avx(ZEXT832(0) << 0x20,_local_a40);
      auVar39._4_4_ = auVar159._4_4_ * fVar147;
      auVar39._0_4_ = auVar159._0_4_ * fVar145;
      auVar39._8_4_ = auVar159._8_4_ * fVar187;
      auVar39._12_4_ = auVar159._12_4_ * fVar188;
      auVar39._16_4_ = auVar159._16_4_ * fVar189;
      auVar39._20_4_ = auVar159._20_4_ * fVar190;
      auVar39._24_4_ = auVar159._24_4_ * fVar191;
      auVar39._28_4_ = auVar159._28_4_;
      auVar84 = vfmadd231ps_fma(auVar39,auVar208,auVar164);
      uStack_c04 = auVar18._28_4_;
      auVar220._0_4_ = local_7c0 ^ (uint)auVar18._0_4_;
      auVar220._4_4_ = uStack_7bc ^ (uint)auVar18._4_4_;
      auVar220._8_4_ = uStack_7b8 ^ (uint)auVar18._8_4_;
      auVar220._12_4_ = uStack_7b4 ^ (uint)auVar18._12_4_;
      auVar220._16_4_ = (uint)fStack_7b0 ^ (uint)auVar18._16_4_;
      auVar220._20_4_ = (uint)fStack_7ac ^ (uint)auVar18._20_4_;
      auVar220._24_4_ = (uint)fStack_7a8 ^ (uint)auVar18._24_4_;
      auVar220._28_4_ = uStack_7a4 ^ uStack_c04;
      auVar164 = vsubps_avx(ZEXT832(0) << 0x20,auVar181);
      auVar83 = vfmadd231ps_fma(ZEXT1632(auVar84),auVar220,auVar164);
      auVar40._4_4_ = (float)local_a00._4_4_ * fVar147;
      auVar40._0_4_ = (float)local_a00._0_4_ * fVar145;
      auVar40._8_4_ = fStack_9f8 * fVar187;
      auVar40._12_4_ = fStack_9f4 * fVar188;
      auVar40._16_4_ = fStack_9f0 * fVar189;
      auVar40._20_4_ = fStack_9ec * fVar190;
      auVar40._24_4_ = fStack_9e8 * fVar191;
      auVar40._28_4_ = uStack_7a4 ^ local_a60._28_4_;
      auVar84 = vfmadd231ps_fma(auVar40,_local_ac0,auVar208);
      auVar151 = vfmadd231ps_fma(ZEXT1632(auVar84),_local_880,auVar220);
      auVar164 = vandps_avx(auVar59,ZEXT1632(auVar151));
      auVar15 = vrcpps_avx(ZEXT1632(auVar151));
      auVar249._8_4_ = 0x219392ef;
      auVar249._0_8_ = 0x219392ef219392ef;
      auVar249._12_4_ = 0x219392ef;
      auVar249._16_4_ = 0x219392ef;
      auVar249._20_4_ = 0x219392ef;
      auVar249._24_4_ = 0x219392ef;
      auVar249._28_4_ = 0x219392ef;
      auVar159 = vcmpps_avx(auVar164,auVar249,1);
      auVar238._8_4_ = 0x3f800000;
      auVar238._0_8_ = 0x3f8000003f800000;
      auVar238._12_4_ = 0x3f800000;
      auVar238._16_4_ = 0x3f800000;
      auVar238._20_4_ = 0x3f800000;
      auVar238._24_4_ = 0x3f800000;
      auVar238._28_4_ = 0x3f800000;
      auVar181 = ZEXT1632(auVar151);
      auVar84 = vfnmadd213ps_fma(auVar15,auVar181,auVar238);
      auVar84 = vfmadd132ps_fma(ZEXT1632(auVar84),auVar15,auVar15);
      auVar221._0_4_ = auVar151._0_4_ ^ local_7c0;
      auVar221._4_4_ = auVar151._4_4_ ^ uStack_7bc;
      auVar221._8_4_ = auVar151._8_4_ ^ uStack_7b8;
      auVar221._12_4_ = auVar151._12_4_ ^ uStack_7b4;
      auVar221._16_4_ = fStack_7b0;
      auVar221._20_4_ = fStack_7ac;
      auVar221._24_4_ = fStack_7a8;
      auVar221._28_4_ = uStack_7a4;
      auVar41._4_4_ = auVar84._4_4_ * (float)(auVar83._4_4_ ^ uStack_7bc);
      auVar41._0_4_ = auVar84._0_4_ * (float)(auVar83._0_4_ ^ local_7c0);
      auVar41._8_4_ = auVar84._8_4_ * (float)(auVar83._8_4_ ^ uStack_7b8);
      auVar41._12_4_ = auVar84._12_4_ * (float)(auVar83._12_4_ ^ uStack_7b4);
      auVar41._16_4_ = fStack_7b0 * 0.0;
      auVar41._20_4_ = fStack_7ac * 0.0;
      auVar41._24_4_ = fStack_7a8 * 0.0;
      auVar41._28_4_ = uStack_7a4;
      auVar164 = vcmpps_avx(auVar181,auVar221,1);
      auVar164 = vorps_avx(auVar164,auVar159);
      auVar164 = vblendvps_avx(auVar41,auVar270,auVar164);
      _local_980 = vmaxps_avx(auVar14,auVar164);
      auVar164 = vcmpps_avx(auVar181,auVar221,6);
      auVar164 = vorps_avx(auVar159,auVar164);
      auVar103._8_4_ = 0x7f800000;
      auVar103._0_8_ = 0x7f8000007f800000;
      auVar103._12_4_ = 0x7f800000;
      auVar103._16_4_ = 0x7f800000;
      auVar103._20_4_ = 0x7f800000;
      auVar103._24_4_ = 0x7f800000;
      auVar103._28_4_ = 0x7f800000;
      auVar164 = vblendvps_avx(auVar41,auVar103,auVar164);
      auVar95 = vandps_avx(auVar95,local_5c0);
      local_3e0 = vminps_avx(auVar206,auVar164);
      auVar164 = vcmpps_avx(_local_980,local_3e0,2);
      auVar159 = auVar95 & auVar164;
      if ((((((((auVar159 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar159 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar159 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar159 >> 0x7f,0) != '\0') ||
            (auVar159 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar159 >> 0xbf,0) != '\0') ||
          (auVar159 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar159[0x1f] < '\0') {
        auVar159 = vminps_avx(local_380,auVar238);
        auVar159 = vmaxps_avx(auVar159,ZEXT832(0) << 0x20);
        auVar63._4_4_ = fStack_39c;
        auVar63._0_4_ = local_3a0;
        auVar63._8_4_ = fStack_398;
        auVar63._12_4_ = fStack_394;
        auVar63._16_4_ = uStack_390;
        auVar63._20_4_ = uStack_38c;
        auVar63._24_4_ = uStack_388;
        auVar63._28_4_ = uStack_384;
        auVar14 = vminps_avx(auVar63,auVar238);
        auVar14 = vmaxps_avx(auVar14,ZEXT832(0) << 0x20);
        auVar42._4_4_ = (auVar159._4_4_ + 1.0) * 0.125;
        auVar42._0_4_ = (auVar159._0_4_ + 0.0) * 0.125;
        auVar42._8_4_ = (auVar159._8_4_ + 2.0) * 0.125;
        auVar42._12_4_ = (auVar159._12_4_ + 3.0) * 0.125;
        auVar42._16_4_ = (auVar159._16_4_ + 4.0) * 0.125;
        auVar42._20_4_ = (auVar159._20_4_ + 5.0) * 0.125;
        auVar42._24_4_ = (auVar159._24_4_ + 6.0) * 0.125;
        auVar42._28_4_ = auVar159._28_4_ + 7.0;
        auVar84 = vfmadd213ps_fma(auVar42,local_820,local_800);
        auVar43._4_4_ = (auVar14._4_4_ + 1.0) * 0.125;
        auVar43._0_4_ = (auVar14._0_4_ + 0.0) * 0.125;
        auVar43._8_4_ = (auVar14._8_4_ + 2.0) * 0.125;
        auVar43._12_4_ = (auVar14._12_4_ + 3.0) * 0.125;
        auVar43._16_4_ = (auVar14._16_4_ + 4.0) * 0.125;
        auVar43._20_4_ = (auVar14._20_4_ + 5.0) * 0.125;
        auVar43._24_4_ = (auVar14._24_4_ + 6.0) * 0.125;
        auVar43._28_4_ = auVar14._28_4_ + 7.0;
        auVar83 = vfmadd213ps_fma(auVar43,local_820,local_800);
        auVar159 = vminps_avx(local_840,auVar180);
        auVar14 = vminps_avx(auVar19,auVar20);
        auVar159 = vminps_avx(auVar159,auVar14);
        auVar96 = vsubps_avx(auVar159,auVar96);
        auVar95 = vandps_avx(auVar164,auVar95);
        local_1a0 = ZEXT1632(auVar84);
        local_1c0 = ZEXT1632(auVar83);
        auVar44._4_4_ = auVar96._4_4_ * 0.99999976;
        auVar44._0_4_ = auVar96._0_4_ * 0.99999976;
        auVar44._8_4_ = auVar96._8_4_ * 0.99999976;
        auVar44._12_4_ = auVar96._12_4_ * 0.99999976;
        auVar44._16_4_ = auVar96._16_4_ * 0.99999976;
        auVar44._20_4_ = auVar96._20_4_ * 0.99999976;
        auVar44._24_4_ = auVar96._24_4_ * 0.99999976;
        auVar44._28_4_ = 0x3f7ffffc;
        auVar164 = vmaxps_avx(ZEXT832(0) << 0x20,auVar44);
        auVar45._4_4_ = auVar164._4_4_ * auVar164._4_4_;
        auVar45._0_4_ = auVar164._0_4_ * auVar164._0_4_;
        auVar45._8_4_ = auVar164._8_4_ * auVar164._8_4_;
        auVar45._12_4_ = auVar164._12_4_ * auVar164._12_4_;
        auVar45._16_4_ = auVar164._16_4_ * auVar164._16_4_;
        auVar45._20_4_ = auVar164._20_4_ * auVar164._20_4_;
        auVar45._24_4_ = auVar164._24_4_ * auVar164._24_4_;
        auVar45._28_4_ = auVar164._28_4_;
        auVar96 = vsubps_avx(auVar16,auVar45);
        auVar46._4_4_ = auVar96._4_4_ * fVar142 * 4.0;
        auVar46._0_4_ = auVar96._0_4_ * fVar140 * 4.0;
        auVar46._8_4_ = auVar96._8_4_ * fVar144 * 4.0;
        auVar46._12_4_ = auVar96._12_4_ * fVar146 * 4.0;
        auVar46._16_4_ = auVar96._16_4_ * fVar148 * 4.0;
        auVar46._20_4_ = auVar96._20_4_ * fVar150 * 4.0;
        auVar46._24_4_ = auVar96._24_4_ * fVar240 * 4.0;
        auVar46._28_4_ = auVar164._28_4_;
        auVar164 = vsubps_avx(auVar32,auVar46);
        auVar56 = ZEXT412(0);
        auVar159 = ZEXT1232(auVar56) << 0x20;
        local_8e0 = ZEXT1232(auVar56) << 0x20;
        _local_aa0 = vcmpps_avx(auVar164,ZEXT832(0) << 0x20,5);
        if ((((((((_local_aa0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (_local_aa0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (_local_aa0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(_local_aa0 >> 0x7f,0) == '\0') &&
              (_local_aa0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(_local_aa0 >> 0xbf,0) == '\0') &&
            (_local_aa0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < local_aa0[0x1f]) {
          _local_900 = ZEXT1232(auVar56) << 0x20;
          auVar182 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar200 = SUB6428(ZEXT864(0),0) << 0x20;
          auVar222._8_4_ = 0x7f800000;
          auVar222._0_8_ = 0x7f8000007f800000;
          auVar222._12_4_ = 0x7f800000;
          auVar222._16_4_ = 0x7f800000;
          auVar222._20_4_ = 0x7f800000;
          auVar222._24_4_ = 0x7f800000;
          auVar222._28_4_ = 0x7f800000;
          auVar228._8_4_ = 0xff800000;
          auVar228._0_8_ = 0xff800000ff800000;
          auVar228._12_4_ = 0xff800000;
          auVar228._16_4_ = 0xff800000;
          auVar228._20_4_ = 0xff800000;
          auVar228._24_4_ = 0xff800000;
          auVar228._28_4_ = 0xff800000;
          _local_8c0 = local_8e0;
        }
        else {
          auVar14 = vsqrtps_avx(auVar164);
          auVar183._0_4_ = fVar140 + fVar140;
          auVar183._4_4_ = fVar142 + fVar142;
          auVar183._8_4_ = fVar144 + fVar144;
          auVar183._12_4_ = fVar146 + fVar146;
          auVar183._16_4_ = fVar148 + fVar148;
          auVar183._20_4_ = fVar150 + fVar150;
          auVar183._24_4_ = fVar240 + fVar240;
          auVar183._28_4_ = fVar116 + fVar116;
          auVar159 = vrcpps_avx(auVar183);
          auVar84 = vfnmadd213ps_fma(auVar183,auVar159,auVar238);
          auVar84 = vfmadd132ps_fma(ZEXT1632(auVar84),auVar159,auVar159);
          auVar209._0_4_ = (uint)local_2c0._0_4_ ^ local_7c0;
          auVar209._4_4_ = (uint)local_2c0._4_4_ ^ uStack_7bc;
          auVar209._8_4_ = (uint)local_2c0._8_4_ ^ uStack_7b8;
          auVar209._12_4_ = (uint)local_2c0._12_4_ ^ uStack_7b4;
          auVar209._16_4_ = (uint)local_2c0._16_4_ ^ (uint)fStack_7b0;
          auVar209._20_4_ = (uint)local_2c0._20_4_ ^ (uint)fStack_7ac;
          auVar209._24_4_ = (uint)local_2c0._24_4_ ^ (uint)fStack_7a8;
          auVar209._28_4_ = (uint)local_2c0._28_4_ ^ uStack_7a4;
          auVar159 = vsubps_avx(auVar209,auVar14);
          auVar14 = vsubps_avx(auVar14,local_2c0);
          fVar145 = auVar159._0_4_ * auVar84._0_4_;
          fVar147 = auVar159._4_4_ * auVar84._4_4_;
          auVar47._4_4_ = fVar147;
          auVar47._0_4_ = fVar145;
          fVar187 = auVar159._8_4_ * auVar84._8_4_;
          auVar47._8_4_ = fVar187;
          fVar188 = auVar159._12_4_ * auVar84._12_4_;
          auVar47._12_4_ = fVar188;
          fVar189 = auVar159._16_4_ * 0.0;
          auVar47._16_4_ = fVar189;
          fVar190 = auVar159._20_4_ * 0.0;
          auVar47._20_4_ = fVar190;
          fVar191 = auVar159._24_4_ * 0.0;
          auVar47._24_4_ = fVar191;
          auVar47._28_4_ = uVar80;
          fVar116 = auVar14._0_4_ * auVar84._0_4_;
          fVar140 = auVar14._4_4_ * auVar84._4_4_;
          auVar48._4_4_ = fVar140;
          auVar48._0_4_ = fVar116;
          fVar142 = auVar14._8_4_ * auVar84._8_4_;
          auVar48._8_4_ = fVar142;
          fVar144 = auVar14._12_4_ * auVar84._12_4_;
          auVar48._12_4_ = fVar144;
          fVar146 = auVar14._16_4_ * 0.0;
          auVar48._16_4_ = fVar146;
          fVar148 = auVar14._20_4_ * 0.0;
          auVar48._20_4_ = fVar148;
          fVar150 = auVar14._24_4_ * 0.0;
          auVar48._24_4_ = fVar150;
          auVar48._28_4_ = 0x3f800000;
          auVar84 = vfmadd213ps_fma(auVar258,auVar47,auVar277);
          auVar83 = vfmadd213ps_fma(auVar258,auVar48,auVar277);
          auVar49._28_4_ = auVar159._28_4_;
          auVar49._0_28_ =
               ZEXT1628(CONCAT412(fVar141 * auVar84._12_4_,
                                  CONCAT48(fVar149 * auVar84._8_4_,
                                           CONCAT44(fVar139 * auVar84._4_4_,fVar115 * auVar84._0_4_)
                                          )));
          auVar159 = ZEXT1632(CONCAT412(auVar83._12_4_ * fVar141,
                                        CONCAT48(auVar83._8_4_ * fVar149,
                                                 CONCAT44(auVar83._4_4_ * fVar139,
                                                          auVar83._0_4_ * fVar115))));
          auVar84 = vfmadd213ps_fma(auVar12,auVar49,auVar179);
          auVar83 = vfmadd213ps_fma(auVar12,auVar159,auVar179);
          auVar151 = vfmadd213ps_fma(auVar13,auVar49,auVar97);
          auVar118 = vfmadd213ps_fma(auVar13,auVar159,auVar97);
          auVar90 = vfmadd213ps_fma(auVar49,auVar182,auVar275);
          auVar86 = vfmadd213ps_fma(auVar182,auVar159,auVar275);
          auVar50._4_4_ = fVar147 * (float)local_880._4_4_;
          auVar50._0_4_ = fVar145 * (float)local_880._0_4_;
          auVar50._8_4_ = fVar187 * fStack_878;
          auVar50._12_4_ = fVar188 * fStack_874;
          auVar50._16_4_ = fVar189 * fStack_870;
          auVar50._20_4_ = fVar190 * fStack_86c;
          auVar50._24_4_ = fVar191 * fStack_868;
          auVar50._28_4_ = 0;
          auVar159 = vsubps_avx(auVar50,ZEXT1632(auVar84));
          auVar184._0_4_ = (float)local_ac0._0_4_ * fVar145;
          auVar184._4_4_ = (float)local_ac0._4_4_ * fVar147;
          auVar184._8_4_ = fStack_ab8 * fVar187;
          auVar184._12_4_ = fStack_ab4 * fVar188;
          auVar184._16_4_ = fStack_ab0 * fVar189;
          auVar184._20_4_ = fStack_aac * fVar190;
          auVar184._24_4_ = fStack_aa8 * fVar191;
          auVar184._28_4_ = 0;
          auVar182 = vsubps_avx(auVar184,ZEXT1632(auVar151));
          auVar223._0_4_ = (float)local_a00._0_4_ * fVar145;
          auVar223._4_4_ = (float)local_a00._4_4_ * fVar147;
          auVar223._8_4_ = fStack_9f8 * fVar187;
          auVar223._12_4_ = fStack_9f4 * fVar188;
          auVar223._16_4_ = fStack_9f0 * fVar189;
          auVar223._20_4_ = fStack_9ec * fVar190;
          auVar223._24_4_ = fStack_9e8 * fVar191;
          auVar223._28_4_ = 0;
          auVar12 = vsubps_avx(auVar223,ZEXT1632(auVar90));
          auVar200 = auVar12._0_28_;
          auVar51._4_4_ = fVar140 * (float)local_880._4_4_;
          auVar51._0_4_ = fVar116 * (float)local_880._0_4_;
          auVar51._8_4_ = fVar142 * fStack_878;
          auVar51._12_4_ = fVar144 * fStack_874;
          auVar51._16_4_ = fVar146 * fStack_870;
          auVar51._20_4_ = fVar148 * fStack_86c;
          auVar51._24_4_ = fVar150 * fStack_868;
          auVar51._28_4_ = 0;
          _local_8c0 = vsubps_avx(auVar51,ZEXT1632(auVar83));
          auVar52._4_4_ = (float)local_ac0._4_4_ * fVar140;
          auVar52._0_4_ = (float)local_ac0._0_4_ * fVar116;
          auVar52._8_4_ = fStack_ab8 * fVar142;
          auVar52._12_4_ = fStack_ab4 * fVar144;
          auVar52._16_4_ = fStack_ab0 * fVar146;
          auVar52._20_4_ = fStack_aac * fVar148;
          auVar52._24_4_ = fStack_aa8 * fVar150;
          auVar52._28_4_ = local_8c0._28_4_;
          local_8e0 = vsubps_avx(auVar52,ZEXT1632(auVar118));
          auVar53._4_4_ = (float)local_a00._4_4_ * fVar140;
          auVar53._0_4_ = (float)local_a00._0_4_ * fVar116;
          auVar53._8_4_ = fStack_9f8 * fVar142;
          auVar53._12_4_ = fStack_9f4 * fVar144;
          auVar53._16_4_ = fStack_9f0 * fVar146;
          auVar53._20_4_ = fStack_9ec * fVar148;
          auVar53._24_4_ = fStack_9e8 * fVar150;
          auVar53._28_4_ = local_8e0._28_4_;
          _local_900 = vsubps_avx(auVar53,ZEXT1632(auVar86));
          auVar259 = ZEXT864(0) << 0x20;
          auVar12 = vcmpps_avx(auVar164,_DAT_01faff00,5);
          auVar224._8_4_ = 0x7f800000;
          auVar224._0_8_ = 0x7f8000007f800000;
          auVar224._12_4_ = 0x7f800000;
          auVar224._16_4_ = 0x7f800000;
          auVar224._20_4_ = 0x7f800000;
          auVar224._24_4_ = 0x7f800000;
          auVar224._28_4_ = 0x7f800000;
          auVar222 = vblendvps_avx(auVar224,auVar47,auVar12);
          auVar60._4_4_ = uStack_89c;
          auVar60._0_4_ = local_8a0;
          auVar60._8_4_ = uStack_898;
          auVar60._12_4_ = uStack_894;
          auVar60._16_4_ = uStack_890;
          auVar60._20_4_ = uStack_88c;
          auVar60._24_4_ = uStack_888;
          auVar60._28_4_ = uStack_884;
          auVar164 = vandps_avx(auVar60,local_9e0);
          auVar164 = vmaxps_avx(local_600,auVar164);
          auVar54._4_4_ = auVar164._4_4_ * 1.9073486e-06;
          auVar54._0_4_ = auVar164._0_4_ * 1.9073486e-06;
          auVar54._8_4_ = auVar164._8_4_ * 1.9073486e-06;
          auVar54._12_4_ = auVar164._12_4_ * 1.9073486e-06;
          auVar54._16_4_ = auVar164._16_4_ * 1.9073486e-06;
          auVar54._20_4_ = auVar164._20_4_ * 1.9073486e-06;
          auVar54._24_4_ = auVar164._24_4_ * 1.9073486e-06;
          auVar54._28_4_ = auVar164._28_4_;
          auVar164 = vandps_avx(auVar60,local_660);
          auVar164 = vcmpps_avx(auVar164,auVar54,1);
          auVar229._8_4_ = 0xff800000;
          auVar229._0_8_ = 0xff800000ff800000;
          auVar229._12_4_ = 0xff800000;
          auVar229._16_4_ = 0xff800000;
          auVar229._20_4_ = 0xff800000;
          auVar229._24_4_ = 0xff800000;
          auVar229._28_4_ = 0xff800000;
          auVar228 = vblendvps_avx(auVar229,auVar48,auVar12);
          auVar13 = auVar12 & auVar164;
          if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar13 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar13 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar13 >> 0x7f,0) != '\0') ||
                (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar13 >> 0xbf,0) != '\0') ||
              (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar13[0x1f] < '\0') {
            auVar164 = vandps_avx(auVar164,auVar12);
            auVar13 = vcmpps_avx(auVar96,ZEXT832(0) << 0x20,2);
            auVar265._8_4_ = 0xff800000;
            auVar265._0_8_ = 0xff800000ff800000;
            auVar265._12_4_ = 0xff800000;
            auVar265._16_4_ = 0xff800000;
            auVar265._20_4_ = 0xff800000;
            auVar265._24_4_ = 0xff800000;
            auVar265._28_4_ = 0xff800000;
            auVar137._8_4_ = 0x7f800000;
            auVar137._0_8_ = 0x7f8000007f800000;
            auVar137._12_4_ = 0x7f800000;
            auVar137._16_4_ = 0x7f800000;
            auVar137._20_4_ = 0x7f800000;
            auVar137._24_4_ = 0x7f800000;
            auVar137._28_4_ = 0x7f800000;
            auVar96 = vblendvps_avx(auVar137,auVar265,auVar13);
            auVar84 = vpackssdw_avx(auVar164._0_16_,auVar164._16_16_);
            auVar14 = vpmovsxwd_avx2(auVar84);
            auVar222 = vblendvps_avx(auVar222,auVar96,auVar14);
            auVar96 = vblendvps_avx(auVar265,auVar137,auVar13);
            auVar259 = ZEXT3264(auVar96);
            auVar228 = vblendvps_avx(auVar228,auVar96,auVar14);
            auVar239._0_8_ = auVar164._0_8_ ^ 0xffffffffffffffff;
            auVar239._8_4_ = auVar164._8_4_ ^ 0xffffffff;
            auVar239._12_4_ = auVar164._12_4_ ^ 0xffffffff;
            auVar239._16_4_ = auVar164._16_4_ ^ 0xffffffff;
            auVar239._20_4_ = auVar164._20_4_ ^ 0xffffffff;
            auVar239._24_4_ = auVar164._24_4_ ^ 0xffffffff;
            auVar239._28_4_ = auVar164._28_4_ ^ 0xffffffff;
            auVar164 = vorps_avx(auVar13,auVar239);
            _local_aa0 = vandps_avx(auVar164,auVar12);
          }
        }
        auVar267 = local_a00._0_28_;
        local_560 = _local_980;
        local_540 = vminps_avx(local_3e0,auVar222);
        local_7e0 = vmaxps_avx(_local_980,auVar228);
        local_400 = local_7e0;
        auVar164 = vcmpps_avx(_local_980,local_540,2);
        local_720 = vandps_avx(auVar164,auVar95);
        auVar164 = vcmpps_avx(local_7e0,local_3e0,2);
        local_760 = vandps_avx(auVar164,auVar95);
        auVar95 = vorps_avx(local_760,local_720);
        if ((((((((auVar95 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar95 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar95 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar95 >> 0x7f,0) != '\0') ||
              (auVar95 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar95 >> 0xbf,0) != '\0') ||
            (auVar95 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar95[0x1f] < '\0') {
          local_780._0_8_ = local_aa0 ^ 0xffffffffffffffff;
          local_780._8_4_ = (uint)fStack_a98 ^ 0xffffffff;
          local_780._12_4_ = (uint)fStack_a94 ^ 0xffffffff;
          local_780._16_4_ = uStack_a90 ^ 0xffffffff;
          local_780._20_4_ = uStack_a8c ^ 0xffffffff;
          local_780._24_4_ = uStack_a88 ^ 0xffffffff;
          local_780._28_4_ = uStack_a84 ^ 0xffffffff;
          auVar55._4_4_ = (float)local_a00._4_4_ * auVar200._4_4_;
          auVar55._0_4_ = (float)local_a00._0_4_ * auVar200._0_4_;
          auVar55._8_4_ = fStack_9f8 * auVar200._8_4_;
          auVar55._12_4_ = fStack_9f4 * auVar200._12_4_;
          auVar55._16_4_ = fStack_9f0 * auVar200._16_4_;
          auVar55._20_4_ = fStack_9ec * auVar200._20_4_;
          auVar55._24_4_ = fStack_9e8 * auVar200._24_4_;
          auVar55._28_4_ = uStack_a84;
          auVar84 = vfmadd213ps_fma(auVar182,_local_ac0,auVar55);
          auVar84 = vfmadd213ps_fma(auVar159,_local_880,ZEXT1632(auVar84));
          auVar61._4_4_ = uStack_89c;
          auVar61._0_4_ = local_8a0;
          auVar61._8_4_ = uStack_898;
          auVar61._12_4_ = uStack_894;
          auVar61._16_4_ = uStack_890;
          auVar61._20_4_ = uStack_88c;
          auVar61._24_4_ = uStack_888;
          auVar61._28_4_ = uStack_884;
          auVar95 = vandps_avx(ZEXT1632(auVar84),auVar61);
          auVar131._8_4_ = 0x3e99999a;
          auVar131._0_8_ = 0x3e99999a3e99999a;
          auVar131._12_4_ = 0x3e99999a;
          auVar131._16_4_ = 0x3e99999a;
          auVar131._20_4_ = 0x3e99999a;
          auVar131._24_4_ = 0x3e99999a;
          auVar131._28_4_ = 0x3e99999a;
          auVar95 = vcmpps_avx(auVar95,auVar131,1);
          auVar95 = vorps_avx(auVar95,local_780);
          auVar132._8_4_ = 3;
          auVar132._0_8_ = 0x300000003;
          auVar132._12_4_ = 3;
          auVar132._16_4_ = 3;
          auVar132._20_4_ = 3;
          auVar132._24_4_ = 3;
          auVar132._28_4_ = 3;
          auVar160._8_4_ = 2;
          auVar160._0_8_ = 0x200000002;
          auVar160._12_4_ = 2;
          auVar160._16_4_ = 2;
          auVar160._20_4_ = 2;
          auVar160._24_4_ = 2;
          auVar160._28_4_ = 2;
          auVar95 = vblendvps_avx(auVar160,auVar132,auVar95);
          local_7a0._4_4_ = local_cc4;
          local_7a0._0_4_ = local_cc4;
          local_7a0._8_4_ = local_cc4;
          local_7a0._12_4_ = local_cc4;
          local_7a0._16_4_ = local_cc4;
          local_7a0._20_4_ = local_cc4;
          local_7a0._24_4_ = local_cc4;
          local_7a0._28_4_ = local_cc4;
          local_740 = vpcmpgtd_avx2(auVar95,local_7a0);
          local_6e0 = vpandn_avx2(local_740,local_720);
          auVar246 = ZEXT3264(local_6e0);
          auVar95 = local_720 & ~local_740;
          fStack_b9c = auVar6._4_4_;
          fStack_b98 = auVar6._8_4_;
          fStack_b94 = auVar6._12_4_;
          if ((((((((auVar95 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar95 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar95 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar95 >> 0x7f,0) == '\0') &&
                (auVar95 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar95 >> 0xbf,0) == '\0') &&
              (auVar95 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar95[0x1f]) {
            auVar104._4_4_ = fVar143;
            auVar104._0_4_ = fVar143;
            auVar104._8_4_ = fVar143;
            auVar104._12_4_ = fVar143;
            auVar104._16_4_ = fVar143;
            auVar104._20_4_ = fVar143;
            auVar104._24_4_ = fVar143;
            auVar104._28_4_ = fVar143;
          }
          else {
            auVar83 = vminps_avx(auVar7,auVar9);
            auVar84 = vmaxps_avx(auVar7,auVar9);
            auVar151 = vminps_avx(auVar8,auVar6);
            auVar118 = vminps_avx(auVar83,auVar151);
            auVar83 = vmaxps_avx(auVar8,auVar6);
            auVar151 = vmaxps_avx(auVar84,auVar83);
            auVar84 = vandps_avx(auVar118,auVar230);
            auVar83 = vandps_avx(auVar151,auVar230);
            auVar84 = vmaxps_avx(auVar84,auVar83);
            auVar83 = vmovshdup_avx(auVar84);
            auVar83 = vmaxss_avx(auVar83,auVar84);
            auVar84 = vshufpd_avx(auVar84,auVar84,1);
            auVar84 = vmaxss_avx(auVar84,auVar83);
            local_aa0._0_4_ = auVar84._0_4_ * 1.9073486e-06;
            local_860 = vshufps_avx(auVar151,auVar151,0xff);
            local_b60._4_4_ = (float)local_980._4_4_ + (float)local_960._4_4_;
            local_b60._0_4_ = (float)local_980._0_4_ + (float)local_960._0_4_;
            fStack_b58 = fStack_978 + fStack_958;
            fStack_b54 = fStack_974 + fStack_954;
            fStack_b50 = fStack_970 + fStack_950;
            fStack_b4c = fStack_96c + fStack_94c;
            fStack_b48 = fStack_968 + fStack_948;
            fStack_b44 = fStack_964 + fStack_944;
            do {
              auVar105._8_4_ = 0x7f800000;
              auVar105._0_8_ = 0x7f8000007f800000;
              auVar105._12_4_ = 0x7f800000;
              auVar105._16_4_ = 0x7f800000;
              auVar105._20_4_ = 0x7f800000;
              auVar105._24_4_ = 0x7f800000;
              auVar105._28_4_ = 0x7f800000;
              auVar95 = auVar246._0_32_;
              auVar164 = vblendvps_avx(auVar105,_local_980,auVar95);
              auVar96 = vshufps_avx(auVar164,auVar164,0xb1);
              auVar96 = vminps_avx(auVar164,auVar96);
              auVar159 = vshufpd_avx(auVar96,auVar96,5);
              auVar96 = vminps_avx(auVar96,auVar159);
              auVar159 = vpermpd_avx2(auVar96,0x4e);
              auVar96 = vminps_avx(auVar96,auVar159);
              auVar164 = vcmpps_avx(auVar164,auVar96,0);
              auVar96 = auVar95 & auVar164;
              if ((((((((auVar96 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar96 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar96 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar96 >> 0x7f,0) != '\0') ||
                    (auVar96 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar96 >> 0xbf,0) != '\0') ||
                  (auVar96 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar96[0x1f] < '\0') {
                auVar95 = vandps_avx(auVar164,auVar95);
              }
              uVar73 = vmovmskps_avx(auVar95);
              iVar21 = 0;
              for (; (uVar73 & 1) == 0; uVar73 = uVar73 >> 1 | 0x80000000) {
                iVar21 = iVar21 + 1;
              }
              uVar74 = iVar21 << 2;
              *(undefined4 *)(local_6e0 + uVar74) = 0;
              uVar73 = *(uint *)(local_1a0 + uVar74);
              uVar74 = *(uint *)(local_560 + uVar74);
              fVar116 = auVar4._0_4_;
              if ((float)local_a20._0_4_ < 0.0) {
                fVar116 = sqrtf((float)local_a20._0_4_);
              }
              local_800._0_4_ = fVar116 * 1.9073486e-06;
              auVar84 = vinsertps_avx(ZEXT416(uVar74),ZEXT416(uVar73),0x10);
              bVar78 = true;
              uVar75 = 0;
              do {
                auVar151 = vmovshdup_avx(auVar84);
                fVar142 = 1.0 - auVar151._0_4_;
                local_9a0._0_16_ = ZEXT416((uint)fVar142);
                auVar83 = vshufps_avx(auVar84,auVar84,0x55);
                fVar116 = auVar83._0_4_;
                auVar119._0_4_ = fVar113 * fVar116;
                fVar115 = auVar83._4_4_;
                auVar119._4_4_ = auVar9._4_4_ * fVar115;
                fVar140 = auVar83._8_4_;
                auVar119._8_4_ = auVar9._8_4_ * fVar140;
                fVar139 = auVar83._12_4_;
                auVar119._12_4_ = auVar9._12_4_ * fVar139;
                auVar152._4_4_ = fVar142;
                auVar152._0_4_ = fVar142;
                auVar152._8_4_ = fVar142;
                auVar152._12_4_ = fVar142;
                auVar83 = vfmadd231ps_fma(auVar119,auVar152,auVar7);
                auVar167._0_4_ = fVar114 * fVar116;
                auVar167._4_4_ = auVar8._4_4_ * fVar115;
                auVar167._8_4_ = auVar8._8_4_ * fVar140;
                auVar167._12_4_ = auVar8._12_4_ * fVar139;
                auVar118 = vfmadd231ps_fma(auVar167,auVar152,auVar9);
                auVar215._0_4_ = fVar116 * auVar118._0_4_;
                auVar215._4_4_ = fVar115 * auVar118._4_4_;
                auVar215._8_4_ = fVar140 * auVar118._8_4_;
                auVar215._12_4_ = fVar139 * auVar118._12_4_;
                auVar90 = vfmadd231ps_fma(auVar215,auVar152,auVar83);
                auVar120._0_4_ = fVar116 * fVar112;
                auVar120._4_4_ = fVar115 * fStack_b9c;
                auVar120._8_4_ = fVar140 * fStack_b98;
                auVar120._12_4_ = fVar139 * fStack_b94;
                auVar83 = vfmadd231ps_fma(auVar120,auVar152,auVar8);
                auVar194._0_4_ = fVar116 * auVar83._0_4_;
                auVar194._4_4_ = fVar115 * auVar83._4_4_;
                auVar194._8_4_ = fVar140 * auVar83._8_4_;
                auVar194._12_4_ = fVar139 * auVar83._12_4_;
                auVar118 = vfmadd231ps_fma(auVar194,auVar152,auVar118);
                fVar149 = auVar84._0_4_;
                auVar121._4_4_ = fVar149;
                auVar121._0_4_ = fVar149;
                auVar121._8_4_ = fVar149;
                auVar121._12_4_ = fVar149;
                auVar83 = vfmadd213ps_fma(auVar121,local_a10,_DAT_01f7aa10);
                auVar85._0_4_ = fVar116 * auVar118._0_4_;
                auVar85._4_4_ = fVar115 * auVar118._4_4_;
                auVar85._8_4_ = fVar140 * auVar118._8_4_;
                auVar85._12_4_ = fVar139 * auVar118._12_4_;
                auVar86 = vfmadd231ps_fma(auVar85,auVar90,auVar152);
                local_9c0._0_16_ = auVar86;
                auVar83 = vsubps_avx(auVar83,auVar86);
                _local_a40 = auVar83;
                auVar83 = vdpps_avx(auVar83,auVar83,0x7f);
                fVar116 = auVar83._0_4_;
                if (fVar116 < 0.0) {
                  local_9a0._0_16_ = ZEXT416((uint)fVar142);
                  auVar246._0_4_ = sqrtf(fVar116);
                  auVar246._4_60_ = extraout_var;
                  auVar86 = auVar246._0_16_;
                }
                else {
                  auVar86 = vsqrtss_avx(auVar83,auVar83);
                }
                auVar118 = vsubps_avx(auVar118,auVar90);
                auVar226._0_4_ = auVar118._0_4_ * 3.0;
                auVar226._4_4_ = auVar118._4_4_ * 3.0;
                auVar226._8_4_ = auVar118._8_4_ * 3.0;
                auVar226._12_4_ = auVar118._12_4_ * 3.0;
                auVar118 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_9a0._0_16_,auVar151)
                ;
                auVar90 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar151,local_9a0._0_16_);
                fVar115 = local_9a0._0_4_ * 6.0;
                fVar140 = auVar118._0_4_ * 6.0;
                fVar139 = auVar90._0_4_ * 6.0;
                fVar142 = auVar151._0_4_ * 6.0;
                auVar168._0_4_ = fVar142 * fVar112;
                auVar168._4_4_ = fVar142 * fStack_b9c;
                auVar168._8_4_ = fVar142 * fStack_b98;
                auVar168._12_4_ = fVar142 * fStack_b94;
                auVar122._4_4_ = fVar139;
                auVar122._0_4_ = fVar139;
                auVar122._8_4_ = fVar139;
                auVar122._12_4_ = fVar139;
                auVar151 = vfmadd132ps_fma(auVar122,auVar168,auVar8);
                auVar169._4_4_ = fVar140;
                auVar169._0_4_ = fVar140;
                auVar169._8_4_ = fVar140;
                auVar169._12_4_ = fVar140;
                auVar151 = vfmadd132ps_fma(auVar169,auVar151,auVar9);
                auVar118 = vdpps_avx(auVar226,auVar226,0x7f);
                auVar123._4_4_ = fVar115;
                auVar123._0_4_ = fVar115;
                auVar123._8_4_ = fVar115;
                auVar123._12_4_ = fVar115;
                auVar166 = vfmadd132ps_fma(auVar123,auVar151,auVar7);
                auVar151 = vblendps_avx(auVar118,_DAT_01f7aa10,0xe);
                auVar90 = vrsqrtss_avx(auVar151,auVar151);
                fVar139 = auVar118._0_4_;
                fVar115 = auVar90._0_4_;
                auVar90 = vdpps_avx(auVar226,auVar166,0x7f);
                fVar115 = fVar115 * 1.5 + fVar139 * -0.5 * fVar115 * fVar115 * fVar115;
                auVar124._0_4_ = auVar166._0_4_ * fVar139;
                auVar124._4_4_ = auVar166._4_4_ * fVar139;
                auVar124._8_4_ = auVar166._8_4_ * fVar139;
                auVar124._12_4_ = auVar166._12_4_ * fVar139;
                fVar140 = auVar90._0_4_;
                auVar216._0_4_ = auVar226._0_4_ * fVar140;
                auVar216._4_4_ = auVar226._4_4_ * fVar140;
                auVar216._8_4_ = auVar226._8_4_ * fVar140;
                auVar216._12_4_ = auVar226._12_4_ * fVar140;
                auVar90 = vsubps_avx(auVar124,auVar216);
                auVar151 = vrcpss_avx(auVar151,auVar151);
                auVar166 = vfnmadd213ss_fma(auVar151,auVar118,ZEXT416(0x40000000));
                fVar140 = auVar151._0_4_ * auVar166._0_4_;
                auVar151 = vmaxss_avx(ZEXT416((uint)local_aa0._0_4_),
                                      ZEXT416((uint)(fVar149 * (float)local_800._0_4_)));
                uVar57 = CONCAT44(auVar226._4_4_,auVar226._0_4_);
                auVar242._0_8_ = uVar57 ^ 0x8000000080000000;
                auVar242._8_4_ = -auVar226._8_4_;
                auVar242._12_4_ = -auVar226._12_4_;
                local_a80._0_4_ = fVar115 * auVar90._0_4_ * fVar140;
                local_a80._4_4_ = fVar115 * auVar90._4_4_ * fVar140;
                local_a80._8_4_ = fVar115 * auVar90._8_4_ * fVar140;
                local_a80._12_4_ = fVar115 * auVar90._12_4_ * fVar140;
                local_a60._0_4_ = auVar226._0_4_ * fVar115;
                local_a60._4_4_ = auVar226._4_4_ * fVar115;
                local_a60._8_4_ = auVar226._8_4_ * fVar115;
                local_a60._12_4_ = auVar226._12_4_ * fVar115;
                local_9a0._0_16_ = auVar226;
                if (fVar139 < -fVar139) {
                  fVar115 = sqrtf(fVar139);
                  auVar86 = ZEXT416(auVar86._0_4_);
                }
                else {
                  auVar118 = vsqrtss_avx(auVar118,auVar118);
                  fVar115 = auVar118._0_4_;
                }
                auVar118 = vdpps_avx(_local_a40,local_a60._0_16_,0x7f);
                auVar193 = vfmadd213ss_fma(ZEXT416((uint)local_aa0._0_4_),auVar86,
                                           ZEXT416((uint)auVar151._0_4_));
                auVar90 = vdpps_avx(auVar242,local_a60._0_16_,0x7f);
                auVar166 = vdpps_avx(_local_a40,local_a80._0_16_,0x7f);
                local_a80._0_16_ = vdpps_avx(local_a10,local_a60._0_16_,0x7f);
                auVar117 = vfmadd213ss_fma(ZEXT416((uint)(auVar86._0_4_ + 1.0)),
                                           ZEXT416((uint)((float)local_aa0._0_4_ / fVar115)),
                                           auVar193);
                fVar140 = auVar118._0_4_;
                auVar87._0_4_ = fVar140 * fVar140;
                auVar87._4_4_ = auVar118._4_4_ * auVar118._4_4_;
                auVar87._8_4_ = auVar118._8_4_ * auVar118._8_4_;
                auVar87._12_4_ = auVar118._12_4_ * auVar118._12_4_;
                auVar86 = vdpps_avx(_local_a40,auVar242,0x7f);
                auVar82 = vsubps_avx(auVar83,auVar87);
                auVar193 = vrsqrtss_avx(auVar82,auVar82);
                fVar139 = auVar82._0_4_;
                fVar115 = auVar193._0_4_;
                fVar115 = fVar115 * 1.5 + fVar139 * -0.5 * fVar115 * fVar115 * fVar115;
                auVar193 = vdpps_avx(_local_a40,local_a10,0x7f);
                local_a60._0_16_ = ZEXT416((uint)(auVar90._0_4_ + auVar166._0_4_));
                local_9e0._0_16_ = vfnmadd231ss_fma(auVar86,auVar118,local_a60._0_16_);
                auVar90 = vfnmadd231ss_fma(auVar193,auVar118,local_a80._0_16_);
                if (fVar139 < 0.0) {
                  local_820._0_4_ = fVar115;
                  local_840._0_16_ = auVar90;
                  fVar139 = sqrtf(fVar139);
                  fVar115 = (float)local_820._0_4_;
                  auVar90 = local_840._0_16_;
                }
                else {
                  auVar86 = vsqrtss_avx(auVar82,auVar82);
                  fVar139 = auVar86._0_4_;
                }
                auVar259 = ZEXT1664(auVar83);
                auVar86 = vpermilps_avx(local_9c0._0_16_,0xff);
                fVar139 = fVar139 - auVar86._0_4_;
                auVar166 = vshufps_avx(local_9a0._0_16_,local_9a0._0_16_,0xff);
                auVar86 = vfmsub213ss_fma(local_9e0._0_16_,ZEXT416((uint)fVar115),auVar166);
                auVar170._0_8_ = local_a80._0_8_ ^ 0x8000000080000000;
                auVar170._8_4_ = local_a80._8_4_ ^ 0x80000000;
                auVar170._12_4_ = local_a80._12_4_ ^ 0x80000000;
                auVar195._0_8_ = auVar86._0_8_ ^ 0x8000000080000000;
                auVar195._8_4_ = auVar86._8_4_ ^ 0x80000000;
                auVar195._12_4_ = auVar86._12_4_ ^ 0x80000000;
                auVar90 = ZEXT416((uint)(auVar90._0_4_ * fVar115));
                auVar86 = vfmsub231ss_fma(ZEXT416((uint)(local_a80._0_4_ * auVar86._0_4_)),
                                          local_a60._0_16_,auVar90);
                auVar90 = vinsertps_avx(auVar195,auVar90,0x1c);
                uVar80 = auVar86._0_4_;
                auVar196._4_4_ = uVar80;
                auVar196._0_4_ = uVar80;
                auVar196._8_4_ = uVar80;
                auVar196._12_4_ = uVar80;
                auVar90 = vdivps_avx(auVar90,auVar196);
                auVar86 = vinsertps_avx(local_a60._0_16_,auVar170,0x10);
                auVar86 = vdivps_avx(auVar86,auVar196);
                auVar153._0_4_ = fVar140 * auVar90._0_4_ + fVar139 * auVar86._0_4_;
                auVar153._4_4_ = fVar140 * auVar90._4_4_ + fVar139 * auVar86._4_4_;
                auVar153._8_4_ = fVar140 * auVar90._8_4_ + fVar139 * auVar86._8_4_;
                auVar153._12_4_ = fVar140 * auVar90._12_4_ + fVar139 * auVar86._12_4_;
                auVar84 = vsubps_avx(auVar84,auVar153);
                auVar118 = vandps_avx(auVar118,auVar230);
                auVar267 = _local_a00;
                if (auVar118._0_4_ < auVar117._0_4_) {
                  auVar118 = vfmadd231ss_fma(ZEXT416((uint)(auVar117._0_4_ + auVar151._0_4_)),
                                             local_860,ZEXT416(0x36000000));
                  auVar151 = vandps_avx(ZEXT416((uint)fVar139),auVar230);
                  if (auVar151._0_4_ < auVar118._0_4_) {
                    fVar115 = auVar84._0_4_ + (float)local_920._0_4_;
                    if (fVar115 < fVar79) {
                      bVar69 = 0;
                      goto LAB_015e7b93;
                    }
                    fVar140 = *(float *)(ray + k * 4 + 0x100);
                    if (fVar115 <= fVar140) {
                      auVar84 = vmovshdup_avx(auVar84);
                      bVar69 = 0;
                      if ((auVar84._0_4_ < 0.0) || (1.0 < auVar84._0_4_)) goto LAB_015e7b93;
                      auVar151 = vrsqrtss_avx(auVar83,auVar83);
                      fVar139 = auVar151._0_4_;
                      pGVar2 = (context->scene->geometries).items[uVar70].ptr;
                      if ((pGVar2->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                        bVar69 = 0;
                        goto LAB_015e7b93;
                      }
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (bVar69 = 1, pGVar2->occlusionFilterN == (RTCFilterFunctionN)0x0))
                      goto LAB_015e7b93;
                      fVar116 = fVar139 * 1.5 + fVar116 * -0.5 * fVar139 * fVar139 * fVar139;
                      auVar171._0_4_ = fVar116 * (float)local_a40._0_4_;
                      auVar171._4_4_ = fVar116 * (float)local_a40._4_4_;
                      auVar171._8_4_ = fVar116 * fStack_a38;
                      auVar171._12_4_ = fVar116 * fStack_a34;
                      auVar86 = vfmadd213ps_fma(auVar166,auVar171,local_9a0._0_16_);
                      auVar151 = vshufps_avx(auVar171,auVar171,0xc9);
                      auVar118 = vshufps_avx(local_9a0._0_16_,local_9a0._0_16_,0xc9);
                      auVar172._0_4_ = auVar171._0_4_ * auVar118._0_4_;
                      auVar172._4_4_ = auVar171._4_4_ * auVar118._4_4_;
                      auVar172._8_4_ = auVar171._8_4_ * auVar118._8_4_;
                      auVar172._12_4_ = auVar171._12_4_ * auVar118._12_4_;
                      auVar90 = vfmsub231ps_fma(auVar172,local_9a0._0_16_,auVar151);
                      auVar151 = vshufps_avx(auVar90,auVar90,0xc9);
                      auVar118 = vshufps_avx(auVar86,auVar86,0xc9);
                      auVar90 = vshufps_avx(auVar90,auVar90,0xd2);
                      auVar88._0_4_ = auVar86._0_4_ * auVar90._0_4_;
                      auVar88._4_4_ = auVar86._4_4_ * auVar90._4_4_;
                      auVar88._8_4_ = auVar86._8_4_ * auVar90._8_4_;
                      auVar88._12_4_ = auVar86._12_4_ * auVar90._12_4_;
                      auVar151 = vfmsub231ps_fma(auVar88,auVar151,auVar118);
                      local_4c0 = auVar84._0_8_;
                      auVar84 = vmovshdup_avx(auVar151);
                      local_520._8_8_ = auVar84._0_8_;
                      auVar84 = vshufps_avx(auVar151,auVar151,0xaa);
                      local_500 = auVar84._0_8_;
                      local_4e0 = auVar151._0_4_;
                      local_520._0_8_ = local_520._8_8_;
                      local_520._16_8_ = local_520._8_8_;
                      local_520._24_8_ = local_520._8_8_;
                      uStack_4f8 = local_500;
                      uStack_4f0 = local_500;
                      uStack_4e8 = local_500;
                      uStack_4dc = local_4e0;
                      uStack_4d8 = local_4e0;
                      uStack_4d4 = local_4e0;
                      uStack_4d0 = local_4e0;
                      uStack_4cc = local_4e0;
                      uStack_4c8 = local_4e0;
                      uStack_4c4 = local_4e0;
                      uStack_4b8 = local_4c0;
                      uStack_4b0 = local_4c0;
                      uStack_4a8 = local_4c0;
                      auVar154._12_4_ = 0;
                      auVar154._0_12_ = ZEXT812(0);
                      auVar154 = auVar154 << 0x20;
                      local_4a0 = ZEXT1232(ZEXT812(0)) << 0x20;
                      local_480 = CONCAT44(uStack_63c,local_640);
                      uStack_478 = CONCAT44(uStack_634,uStack_638);
                      uStack_470 = CONCAT44(uStack_62c,uStack_630);
                      uStack_468 = CONCAT44(uStack_624,uStack_628);
                      local_460._4_4_ = uStack_61c;
                      local_460._0_4_ = local_620;
                      local_460._8_4_ = uStack_618;
                      local_460._12_4_ = uStack_614;
                      local_460._16_4_ = uStack_610;
                      local_460._20_4_ = uStack_60c;
                      local_460._24_4_ = uStack_608;
                      local_460._28_4_ = uStack_604;
                      vpcmpeqd_avx2(local_460,local_460);
                      local_440 = context->user->instID[0];
                      uStack_43c = local_440;
                      uStack_438 = local_440;
                      uStack_434 = local_440;
                      uStack_430 = local_440;
                      uStack_42c = local_440;
                      uStack_428 = local_440;
                      uStack_424 = local_440;
                      local_420 = context->user->instPrimID[0];
                      uStack_41c = local_420;
                      uStack_418 = local_420;
                      uStack_414 = local_420;
                      uStack_410 = local_420;
                      uStack_40c = local_420;
                      uStack_408 = local_420;
                      uStack_404 = local_420;
                      *(float *)(ray + k * 4 + 0x100) = fVar115;
                      local_940 = local_680;
                      local_b10.valid = (int *)local_940;
                      local_b10.geometryUserPtr = pGVar2->userPtr;
                      local_b10.context = context->user;
                      local_b10.hit = (RTCHitN *)local_520;
                      local_b10.N = 8;
                      local_b10.ray = (RTCRayN *)ray;
                      if (pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar259 = ZEXT1664(auVar83);
                        (*pGVar2->occlusionFilterN)(&local_b10);
                        auVar154 = ZEXT816(0) << 0x40;
                      }
                      auVar164 = ZEXT1632(auVar154);
                      auVar95 = vpcmpeqd_avx2(local_940,auVar164);
                      auVar95 = _DAT_01fe9960 & ~auVar95;
                      auVar267 = _local_a00;
                      if ((((((((auVar95 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar95 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar95 >> 0x5f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) || SUB321(auVar95 >> 0x7f,0) != '\0') ||
                            (auVar95 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar95 >> 0xbf,0) != '\0') ||
                          (auVar95 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar95[0x1f] < '\0') {
                        p_Var3 = context->args->filter;
                        if ((p_Var3 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar2->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar259 = ZEXT1664(auVar259._0_16_);
                          (*p_Var3)(&local_b10);
                          auVar164 = ZEXT832(0) << 0x40;
                          auVar267 = _local_a00;
                        }
                        auVar164 = vpcmpeqd_avx2(local_940,auVar164);
                        auVar133._8_4_ = 0xff800000;
                        auVar133._0_8_ = 0xff800000ff800000;
                        auVar133._12_4_ = 0xff800000;
                        auVar133._16_4_ = 0xff800000;
                        auVar133._20_4_ = 0xff800000;
                        auVar133._24_4_ = 0xff800000;
                        auVar133._28_4_ = 0xff800000;
                        auVar95 = vblendvps_avx(auVar133,*(undefined1 (*) [32])
                                                          (local_b10.ray + 0x100),auVar164);
                        *(undefined1 (*) [32])(local_b10.ray + 0x100) = auVar95;
                        auVar95 = _DAT_01fe9960 & ~auVar164;
                        if ((((((((auVar95 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 || (auVar95 >> 0x3f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                (auVar95 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || SUB321(auVar95 >> 0x7f,0) != '\0') ||
                              (auVar95 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                             SUB321(auVar95 >> 0xbf,0) != '\0') ||
                            (auVar95 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                            auVar95[0x1f] < '\0') {
                          bVar69 = 1;
                          goto LAB_015e7b93;
                        }
                      }
                      *(float *)(ray + k * 4 + 0x100) = fVar140;
                    }
                    bVar69 = 0;
                    goto LAB_015e7b93;
                  }
                }
                bVar78 = uVar75 < 4;
                uVar75 = uVar75 + 1;
              } while (uVar75 != 5);
              bVar78 = false;
              bVar69 = 5;
LAB_015e7b93:
              bVar77 = (bool)(bVar77 | bVar78 & bVar69);
              uVar80 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar104._4_4_ = uVar80;
              auVar104._0_4_ = uVar80;
              auVar104._8_4_ = uVar80;
              auVar104._12_4_ = uVar80;
              auVar104._16_4_ = uVar80;
              auVar104._20_4_ = uVar80;
              auVar104._24_4_ = uVar80;
              auVar104._28_4_ = uVar80;
              auVar164 = vcmpps_avx(_local_b60,auVar104,2);
              auVar95 = vandps_avx(auVar164,local_6e0);
              auVar246 = ZEXT3264(auVar95);
              auVar164 = local_6e0 & auVar164;
              local_6e0 = auVar95;
            } while ((((((((auVar164 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar164 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar164 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar164 >> 0x7f,0) != '\0') ||
                       (auVar164 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar164 >> 0xbf,0) != '\0') ||
                     (auVar164 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar164[0x1f] < '\0');
          }
          auVar96 = local_400;
          auVar138._0_4_ = auVar267._0_4_ * (float)local_900._0_4_;
          auVar138._4_4_ = auVar267._4_4_ * (float)local_900._4_4_;
          auVar138._8_4_ = auVar267._8_4_ * fStack_8f8;
          auVar138._12_4_ = auVar267._12_4_ * fStack_8f4;
          auVar138._16_4_ = auVar267._16_4_ * fStack_8f0;
          auVar138._20_4_ = auVar267._20_4_ * fStack_8ec;
          auVar138._28_36_ = auVar246._28_36_;
          auVar138._24_4_ = auVar267._24_4_ * fStack_8e8;
          auVar84 = vfmadd213ps_fma(local_8e0,_local_ac0,auVar138._0_32_);
          auVar84 = vfmadd213ps_fma(_local_8c0,_local_880,ZEXT1632(auVar84));
          auVar62._4_4_ = uStack_89c;
          auVar62._0_4_ = local_8a0;
          auVar62._8_4_ = uStack_898;
          auVar62._12_4_ = uStack_894;
          auVar62._16_4_ = uStack_890;
          auVar62._20_4_ = uStack_88c;
          auVar62._24_4_ = uStack_888;
          auVar62._28_4_ = uStack_884;
          auVar95 = vandps_avx(ZEXT1632(auVar84),auVar62);
          auVar161._8_4_ = 0x3e99999a;
          auVar161._0_8_ = 0x3e99999a3e99999a;
          auVar161._12_4_ = 0x3e99999a;
          auVar161._16_4_ = 0x3e99999a;
          auVar161._20_4_ = 0x3e99999a;
          auVar161._24_4_ = 0x3e99999a;
          auVar161._28_4_ = 0x3e99999a;
          auVar95 = vcmpps_avx(auVar95,auVar161,1);
          auVar164 = vorps_avx(auVar95,local_780);
          auVar162._0_4_ = local_7e0._0_4_ + (float)local_960._0_4_;
          auVar162._4_4_ = local_7e0._4_4_ + (float)local_960._4_4_;
          auVar162._8_4_ = local_7e0._8_4_ + fStack_958;
          auVar162._12_4_ = local_7e0._12_4_ + fStack_954;
          auVar162._16_4_ = local_7e0._16_4_ + fStack_950;
          auVar162._20_4_ = local_7e0._20_4_ + fStack_94c;
          auVar162._24_4_ = local_7e0._24_4_ + fStack_948;
          auVar162._28_4_ = local_7e0._28_4_ + fStack_944;
          auVar95 = vcmpps_avx(auVar162,auVar104,2);
          local_8e0 = vandps_avx(auVar95,local_760);
          auVar163._8_4_ = 3;
          auVar163._0_8_ = 0x300000003;
          auVar163._12_4_ = 3;
          auVar163._16_4_ = 3;
          auVar163._20_4_ = 3;
          auVar163._24_4_ = 3;
          auVar163._28_4_ = 3;
          auVar185._8_4_ = 2;
          auVar185._0_8_ = 0x200000002;
          auVar185._12_4_ = 2;
          auVar185._16_4_ = 2;
          auVar185._20_4_ = 2;
          auVar185._24_4_ = 2;
          auVar185._28_4_ = 2;
          auVar95 = vblendvps_avx(auVar185,auVar163,auVar164);
          _local_900 = vpcmpgtd_avx2(auVar95,local_7a0);
          auVar95 = vpandn_avx2(_local_900,local_8e0);
          auVar164 = local_8e0 & ~_local_900;
          local_700 = auVar95;
          if ((((((((auVar164 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar164 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar164 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar164 >> 0x7f,0) != '\0') ||
                (auVar164 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar164 >> 0xbf,0) != '\0') ||
              (auVar164 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar164[0x1f] < '\0') {
            auVar83 = vminps_avx(auVar7,auVar9);
            auVar84 = vmaxps_avx(auVar7,auVar9);
            auVar151 = vminps_avx(auVar8,auVar6);
            auVar118 = vminps_avx(auVar83,auVar151);
            auVar83 = vmaxps_avx(auVar8,auVar6);
            auVar151 = vmaxps_avx(auVar84,auVar83);
            auVar84 = vandps_avx(auVar118,auVar230);
            auVar83 = vandps_avx(auVar151,auVar230);
            auVar84 = vmaxps_avx(auVar84,auVar83);
            auVar83 = vmovshdup_avx(auVar84);
            auVar83 = vmaxss_avx(auVar83,auVar84);
            auVar84 = vshufpd_avx(auVar84,auVar84,1);
            auVar84 = vmaxss_avx(auVar84,auVar83);
            fVar116 = auVar84._0_4_ * 1.9073486e-06;
            local_860 = vshufps_avx(auVar151,auVar151,0xff);
            local_8c0._4_4_ = (float)local_960._4_4_ + local_400._4_4_;
            local_8c0._0_4_ = (float)local_960._0_4_ + local_400._0_4_;
            fStack_8b8 = fStack_958 + local_400._8_4_;
            fStack_8b4 = fStack_954 + local_400._12_4_;
            fStack_8b0 = fStack_950 + local_400._16_4_;
            fStack_8ac = fStack_94c + local_400._20_4_;
            fStack_8a8 = fStack_948 + local_400._24_4_;
            fStack_8a4 = fStack_944 + local_400._28_4_;
            do {
              auVar106._8_4_ = 0x7f800000;
              auVar106._0_8_ = 0x7f8000007f800000;
              auVar106._12_4_ = 0x7f800000;
              auVar106._16_4_ = 0x7f800000;
              auVar106._20_4_ = 0x7f800000;
              auVar106._24_4_ = 0x7f800000;
              auVar106._28_4_ = 0x7f800000;
              auVar164 = vblendvps_avx(auVar106,auVar96,auVar95);
              auVar159 = vshufps_avx(auVar164,auVar164,0xb1);
              auVar159 = vminps_avx(auVar164,auVar159);
              auVar12 = vshufpd_avx(auVar159,auVar159,5);
              auVar159 = vminps_avx(auVar159,auVar12);
              auVar12 = vpermpd_avx2(auVar159,0x4e);
              auVar159 = vminps_avx(auVar159,auVar12);
              auVar159 = vcmpps_avx(auVar164,auVar159,0);
              auVar12 = auVar95 & auVar159;
              auVar164 = auVar95;
              if ((((((((auVar12 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar12 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar12 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar12 >> 0x7f,0) != '\0') ||
                    (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar12 >> 0xbf,0) != '\0') ||
                  (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar12[0x1f] < '\0') {
                auVar164 = vandps_avx(auVar159,auVar95);
              }
              uVar73 = vmovmskps_avx(auVar164);
              iVar21 = 0;
              for (; (uVar73 & 1) == 0; uVar73 = uVar73 >> 1 | 0x80000000) {
                iVar21 = iVar21 + 1;
              }
              uVar74 = iVar21 << 2;
              local_700 = auVar95;
              *(undefined4 *)(local_700 + uVar74) = 0;
              uVar73 = *(uint *)(local_1c0 + uVar74);
              uVar74 = *(uint *)(local_3e0 + uVar74);
              fVar115 = auVar5._0_4_;
              if ((float)local_a20._0_4_ < 0.0) {
                fVar115 = sqrtf((float)local_a20._0_4_);
              }
              local_800._0_4_ = fVar115 * 1.9073486e-06;
              auVar84 = vinsertps_avx(ZEXT416(uVar74),ZEXT416(uVar73),0x10);
              bVar78 = true;
              uVar75 = 0;
              do {
                _local_a40 = vmovshdup_avx(auVar84);
                fVar149 = 1.0 - local_a40._0_4_;
                auVar83 = vshufps_avx(auVar84,auVar84,0x55);
                fVar115 = auVar83._0_4_;
                auVar125._0_4_ = fVar113 * fVar115;
                fVar140 = auVar83._4_4_;
                auVar125._4_4_ = auVar9._4_4_ * fVar140;
                fVar139 = auVar83._8_4_;
                auVar125._8_4_ = auVar9._8_4_ * fVar139;
                fVar142 = auVar83._12_4_;
                auVar125._12_4_ = auVar9._12_4_ * fVar142;
                auVar155._4_4_ = fVar149;
                auVar155._0_4_ = fVar149;
                auVar155._8_4_ = fVar149;
                auVar155._12_4_ = fVar149;
                auVar83 = vfmadd231ps_fma(auVar125,auVar155,auVar7);
                auVar173._0_4_ = fVar114 * fVar115;
                auVar173._4_4_ = auVar8._4_4_ * fVar140;
                auVar173._8_4_ = auVar8._8_4_ * fVar139;
                auVar173._12_4_ = auVar8._12_4_ * fVar142;
                auVar151 = vfmadd231ps_fma(auVar173,auVar155,auVar9);
                auVar217._0_4_ = fVar115 * auVar151._0_4_;
                auVar217._4_4_ = fVar140 * auVar151._4_4_;
                auVar217._8_4_ = fVar139 * auVar151._8_4_;
                auVar217._12_4_ = fVar142 * auVar151._12_4_;
                auVar118 = vfmadd231ps_fma(auVar217,auVar155,auVar83);
                auVar126._0_4_ = fVar115 * fVar112;
                auVar126._4_4_ = fVar140 * fStack_b9c;
                auVar126._8_4_ = fVar139 * fStack_b98;
                auVar126._12_4_ = fVar142 * fStack_b94;
                auVar83 = vfmadd231ps_fma(auVar126,auVar155,auVar8);
                auVar197._0_4_ = fVar115 * auVar83._0_4_;
                auVar197._4_4_ = fVar140 * auVar83._4_4_;
                auVar197._8_4_ = fVar139 * auVar83._8_4_;
                auVar197._12_4_ = fVar142 * auVar83._12_4_;
                auVar151 = vfmadd231ps_fma(auVar197,auVar155,auVar151);
                fVar144 = auVar84._0_4_;
                auVar127._4_4_ = fVar144;
                auVar127._0_4_ = fVar144;
                auVar127._8_4_ = fVar144;
                auVar127._12_4_ = fVar144;
                auVar83 = vfmadd213ps_fma(auVar127,local_a10,_DAT_01f7aa10);
                auVar89._0_4_ = fVar115 * auVar151._0_4_;
                auVar89._4_4_ = fVar140 * auVar151._4_4_;
                auVar89._8_4_ = fVar139 * auVar151._8_4_;
                auVar89._12_4_ = fVar142 * auVar151._12_4_;
                auVar90 = vfmadd231ps_fma(auVar89,auVar118,auVar155);
                local_9a0._0_16_ = auVar90;
                auVar83 = vsubps_avx(auVar83,auVar90);
                _local_aa0 = auVar83;
                auVar83 = vdpps_avx(auVar83,auVar83,0x7f);
                fVar115 = auVar83._0_4_;
                if (fVar115 < 0.0) {
                  local_9c0._0_16_ = ZEXT416((uint)fVar149);
                  auVar111._0_4_ = sqrtf(fVar115);
                  auVar111._4_60_ = extraout_var_00;
                  auVar90 = auVar111._0_16_;
                  auVar86 = local_9c0._0_16_;
                }
                else {
                  auVar90 = vsqrtss_avx(auVar83,auVar83);
                  auVar86 = ZEXT416((uint)fVar149);
                }
                auVar151 = vsubps_avx(auVar151,auVar118);
                auVar227._0_4_ = auVar151._0_4_ * 3.0;
                auVar227._4_4_ = auVar151._4_4_ * 3.0;
                auVar227._8_4_ = auVar151._8_4_ * 3.0;
                auVar227._12_4_ = auVar151._12_4_ * 3.0;
                auVar151 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar86,_local_a40);
                auVar118 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),_local_a40,auVar86);
                fVar140 = auVar86._0_4_ * 6.0;
                fVar139 = auVar151._0_4_ * 6.0;
                fVar142 = auVar118._0_4_ * 6.0;
                fVar149 = local_a40._0_4_ * 6.0;
                auVar174._0_4_ = fVar149 * fVar112;
                auVar174._4_4_ = fVar149 * fStack_b9c;
                auVar174._8_4_ = fVar149 * fStack_b98;
                auVar174._12_4_ = fVar149 * fStack_b94;
                auVar128._4_4_ = fVar142;
                auVar128._0_4_ = fVar142;
                auVar128._8_4_ = fVar142;
                auVar128._12_4_ = fVar142;
                auVar151 = vfmadd132ps_fma(auVar128,auVar174,auVar8);
                auVar175._4_4_ = fVar139;
                auVar175._0_4_ = fVar139;
                auVar175._8_4_ = fVar139;
                auVar175._12_4_ = fVar139;
                auVar151 = vfmadd132ps_fma(auVar175,auVar151,auVar9);
                auVar118 = vdpps_avx(auVar227,auVar227,0x7f);
                auVar129._4_4_ = fVar140;
                auVar129._0_4_ = fVar140;
                auVar129._8_4_ = fVar140;
                auVar129._12_4_ = fVar140;
                auVar166 = vfmadd132ps_fma(auVar129,auVar151,auVar7);
                auVar151 = vblendps_avx(auVar118,_DAT_01f7aa10,0xe);
                auVar86 = vrsqrtss_avx(auVar151,auVar151);
                fVar142 = auVar118._0_4_;
                fVar140 = auVar86._0_4_;
                auVar86 = vdpps_avx(auVar227,auVar166,0x7f);
                fVar140 = fVar140 * 1.5 + fVar142 * -0.5 * fVar140 * fVar140 * fVar140;
                auVar130._0_4_ = auVar166._0_4_ * fVar142;
                auVar130._4_4_ = auVar166._4_4_ * fVar142;
                auVar130._8_4_ = auVar166._8_4_ * fVar142;
                auVar130._12_4_ = auVar166._12_4_ * fVar142;
                fVar139 = auVar86._0_4_;
                auVar218._0_4_ = auVar227._0_4_ * fVar139;
                auVar218._4_4_ = auVar227._4_4_ * fVar139;
                auVar218._8_4_ = auVar227._8_4_ * fVar139;
                auVar218._12_4_ = auVar227._12_4_ * fVar139;
                auVar86 = vsubps_avx(auVar130,auVar218);
                auVar151 = vrcpss_avx(auVar151,auVar151);
                auVar166 = vfnmadd213ss_fma(auVar151,auVar118,ZEXT416(0x40000000));
                fVar139 = auVar151._0_4_ * auVar166._0_4_;
                auVar151 = vmaxss_avx(ZEXT416((uint)fVar116),
                                      ZEXT416((uint)(fVar144 * (float)local_800._0_4_)));
                auVar246 = ZEXT1664(auVar151);
                uVar57 = CONCAT44(auVar227._4_4_,auVar227._0_4_);
                auVar243._0_8_ = uVar57 ^ 0x8000000080000000;
                auVar243._8_4_ = -auVar227._8_4_;
                auVar243._12_4_ = -auVar227._12_4_;
                local_a80._0_4_ = fVar140 * auVar86._0_4_ * fVar139;
                local_a80._4_4_ = fVar140 * auVar86._4_4_ * fVar139;
                local_a80._8_4_ = fVar140 * auVar86._8_4_ * fVar139;
                local_a80._12_4_ = fVar140 * auVar86._12_4_ * fVar139;
                local_a60._0_4_ = auVar227._0_4_ * fVar140;
                local_a60._4_4_ = auVar227._4_4_ * fVar140;
                local_a60._8_4_ = auVar227._8_4_ * fVar140;
                local_a60._12_4_ = auVar227._12_4_ * fVar140;
                _local_a40 = auVar227;
                local_9c0._0_4_ = auVar151._0_4_;
                if (fVar142 < -fVar142) {
                  fVar140 = sqrtf(fVar142);
                  auVar90 = ZEXT416(auVar90._0_4_);
                  auVar246 = ZEXT464((uint)local_9c0._0_4_);
                }
                else {
                  auVar151 = vsqrtss_avx(auVar118,auVar118);
                  fVar140 = auVar151._0_4_;
                }
                auVar151 = vdpps_avx(_local_aa0,local_a60._0_16_,0x7f);
                auVar166 = vfmadd213ss_fma(ZEXT416((uint)fVar116),auVar90,auVar246._0_16_);
                auVar118 = vdpps_avx(auVar243,local_a60._0_16_,0x7f);
                auVar86 = vdpps_avx(_local_aa0,local_a80._0_16_,0x7f);
                local_a80._0_16_ = vdpps_avx(local_a10,local_a60._0_16_,0x7f);
                auVar82 = vfmadd213ss_fma(ZEXT416((uint)(auVar90._0_4_ + 1.0)),
                                          ZEXT416((uint)(fVar116 / fVar140)),auVar166);
                fVar139 = auVar151._0_4_;
                auVar91._0_4_ = fVar139 * fVar139;
                auVar91._4_4_ = auVar151._4_4_ * auVar151._4_4_;
                auVar91._8_4_ = auVar151._8_4_ * auVar151._8_4_;
                auVar91._12_4_ = auVar151._12_4_ * auVar151._12_4_;
                auVar90 = vdpps_avx(_local_aa0,auVar243,0x7f);
                auVar193 = vsubps_avx(auVar83,auVar91);
                auVar166 = vrsqrtss_avx(auVar193,auVar193);
                fVar142 = auVar193._0_4_;
                fVar140 = auVar166._0_4_;
                fVar140 = fVar140 * 1.5 + fVar142 * -0.5 * fVar140 * fVar140 * fVar140;
                auVar166 = vdpps_avx(_local_aa0,local_a10,0x7f);
                local_a60._0_16_ = ZEXT416((uint)(auVar118._0_4_ + auVar86._0_4_));
                local_9e0._0_16_ = vfnmadd231ss_fma(auVar90,auVar151,local_a60._0_16_);
                auVar118 = vfnmadd231ss_fma(auVar166,auVar151,local_a80._0_16_);
                if (fVar142 < 0.0) {
                  local_820._0_4_ = fVar140;
                  local_840._0_16_ = auVar118;
                  fVar142 = sqrtf(fVar142);
                  auVar246 = ZEXT464((uint)local_9c0._0_4_);
                  fVar140 = (float)local_820._0_4_;
                  auVar118 = local_840._0_16_;
                }
                else {
                  auVar90 = vsqrtss_avx(auVar193,auVar193);
                  fVar142 = auVar90._0_4_;
                }
                auVar259 = ZEXT1664(_local_a40);
                auVar90 = vpermilps_avx(local_9a0._0_16_,0xff);
                fVar142 = fVar142 - auVar90._0_4_;
                auVar86 = vshufps_avx(_local_a40,_local_a40,0xff);
                auVar90 = vfmsub213ss_fma(local_9e0._0_16_,ZEXT416((uint)fVar140),auVar86);
                auVar176._0_8_ = local_a80._0_8_ ^ 0x8000000080000000;
                auVar176._8_4_ = local_a80._8_4_ ^ 0x80000000;
                auVar176._12_4_ = local_a80._12_4_ ^ 0x80000000;
                auVar198._0_8_ = auVar90._0_8_ ^ 0x8000000080000000;
                auVar198._8_4_ = auVar90._8_4_ ^ 0x80000000;
                auVar198._12_4_ = auVar90._12_4_ ^ 0x80000000;
                auVar118 = ZEXT416((uint)(auVar118._0_4_ * fVar140));
                auVar90 = vfmsub231ss_fma(ZEXT416((uint)(local_a80._0_4_ * auVar90._0_4_)),
                                          local_a60._0_16_,auVar118);
                auVar118 = vinsertps_avx(auVar198,auVar118,0x1c);
                uVar80 = auVar90._0_4_;
                auVar199._4_4_ = uVar80;
                auVar199._0_4_ = uVar80;
                auVar199._8_4_ = uVar80;
                auVar199._12_4_ = uVar80;
                auVar118 = vdivps_avx(auVar118,auVar199);
                auVar90 = vinsertps_avx(local_a60._0_16_,auVar176,0x10);
                auVar90 = vdivps_avx(auVar90,auVar199);
                auVar156._0_4_ = fVar139 * auVar118._0_4_ + fVar142 * auVar90._0_4_;
                auVar156._4_4_ = fVar139 * auVar118._4_4_ + fVar142 * auVar90._4_4_;
                auVar156._8_4_ = fVar139 * auVar118._8_4_ + fVar142 * auVar90._8_4_;
                auVar156._12_4_ = fVar139 * auVar118._12_4_ + fVar142 * auVar90._12_4_;
                auVar84 = vsubps_avx(auVar84,auVar156);
                auVar151 = vandps_avx(auVar151,auVar230);
                if (auVar151._0_4_ < auVar82._0_4_) {
                  auVar118 = vfmadd231ss_fma(ZEXT416((uint)(auVar246._0_4_ + auVar82._0_4_)),
                                             local_860,ZEXT416(0x36000000));
                  auVar151 = vandps_avx(ZEXT416((uint)fVar142),auVar230);
                  if (auVar151._0_4_ < auVar118._0_4_) {
                    fVar140 = auVar84._0_4_ + (float)local_920._0_4_;
                    if (fVar140 < fVar79) {
                      bVar69 = 0;
                      goto LAB_015e8613;
                    }
                    fVar139 = *(float *)(ray + k * 4 + 0x100);
                    if (fVar140 <= fVar139) {
                      auVar84 = vmovshdup_avx(auVar84);
                      bVar69 = 0;
                      if ((auVar84._0_4_ < 0.0) || (1.0 < auVar84._0_4_)) goto LAB_015e8613;
                      auVar83 = vrsqrtss_avx(auVar83,auVar83);
                      fVar142 = auVar83._0_4_;
                      pGVar2 = (context->scene->geometries).items[uVar70].ptr;
                      if ((pGVar2->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                        bVar69 = 0;
                        goto LAB_015e8613;
                      }
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (bVar69 = 1, pGVar2->occlusionFilterN == (RTCFilterFunctionN)0x0))
                      goto LAB_015e8613;
                      fVar115 = fVar142 * 1.5 + fVar115 * -0.5 * fVar142 * fVar142 * fVar142;
                      auVar177._0_4_ = fVar115 * (float)local_aa0._0_4_;
                      auVar177._4_4_ = fVar115 * (float)local_aa0._4_4_;
                      auVar177._8_4_ = fVar115 * fStack_a98;
                      auVar177._12_4_ = fVar115 * fStack_a94;
                      auVar90 = vfmadd213ps_fma(auVar86,auVar177,_local_a40);
                      auVar83 = vshufps_avx(auVar177,auVar177,0xc9);
                      auVar151 = vshufps_avx(_local_a40,_local_a40,0xc9);
                      auVar178._0_4_ = auVar177._0_4_ * auVar151._0_4_;
                      auVar178._4_4_ = auVar177._4_4_ * auVar151._4_4_;
                      auVar178._8_4_ = auVar177._8_4_ * auVar151._8_4_;
                      auVar178._12_4_ = auVar177._12_4_ * auVar151._12_4_;
                      auVar118 = vfmsub231ps_fma(auVar178,_local_a40,auVar83);
                      auVar83 = vshufps_avx(auVar118,auVar118,0xc9);
                      auVar151 = vshufps_avx(auVar90,auVar90,0xc9);
                      auVar118 = vshufps_avx(auVar118,auVar118,0xd2);
                      auVar92._0_4_ = auVar90._0_4_ * auVar118._0_4_;
                      auVar92._4_4_ = auVar90._4_4_ * auVar118._4_4_;
                      auVar92._8_4_ = auVar90._8_4_ * auVar118._8_4_;
                      auVar92._12_4_ = auVar90._12_4_ * auVar118._12_4_;
                      auVar83 = vfmsub231ps_fma(auVar92,auVar83,auVar151);
                      local_4c0 = auVar84._0_8_;
                      auVar84 = vmovshdup_avx(auVar83);
                      local_520._8_8_ = auVar84._0_8_;
                      auVar84 = vshufps_avx(auVar83,auVar83,0xaa);
                      local_500 = auVar84._0_8_;
                      local_4e0 = auVar83._0_4_;
                      local_520._0_8_ = local_520._8_8_;
                      local_520._16_8_ = local_520._8_8_;
                      local_520._24_8_ = local_520._8_8_;
                      uStack_4f8 = local_500;
                      uStack_4f0 = local_500;
                      uStack_4e8 = local_500;
                      uStack_4dc = local_4e0;
                      uStack_4d8 = local_4e0;
                      uStack_4d4 = local_4e0;
                      uStack_4d0 = local_4e0;
                      uStack_4cc = local_4e0;
                      uStack_4c8 = local_4e0;
                      uStack_4c4 = local_4e0;
                      uStack_4b8 = local_4c0;
                      uStack_4b0 = local_4c0;
                      uStack_4a8 = local_4c0;
                      auVar157._12_4_ = 0;
                      auVar157._0_12_ = ZEXT812(0);
                      auVar157 = auVar157 << 0x20;
                      local_4a0 = ZEXT1232(ZEXT812(0)) << 0x20;
                      local_480 = CONCAT44(uStack_63c,local_640);
                      uStack_478 = CONCAT44(uStack_634,uStack_638);
                      uStack_470 = CONCAT44(uStack_62c,uStack_630);
                      uStack_468 = CONCAT44(uStack_624,uStack_628);
                      local_460._4_4_ = uStack_61c;
                      local_460._0_4_ = local_620;
                      local_460._8_4_ = uStack_618;
                      local_460._12_4_ = uStack_614;
                      local_460._16_4_ = uStack_610;
                      local_460._20_4_ = uStack_60c;
                      local_460._24_4_ = uStack_608;
                      local_460._28_4_ = uStack_604;
                      vpcmpeqd_avx2(local_460,local_460);
                      local_440 = context->user->instID[0];
                      uStack_43c = local_440;
                      uStack_438 = local_440;
                      uStack_434 = local_440;
                      uStack_430 = local_440;
                      uStack_42c = local_440;
                      uStack_428 = local_440;
                      uStack_424 = local_440;
                      local_420 = context->user->instPrimID[0];
                      uStack_41c = local_420;
                      uStack_418 = local_420;
                      uStack_414 = local_420;
                      uStack_410 = local_420;
                      uStack_40c = local_420;
                      uStack_408 = local_420;
                      uStack_404 = local_420;
                      *(float *)(ray + k * 4 + 0x100) = fVar140;
                      local_940 = local_680;
                      local_b10.valid = (int *)local_940;
                      local_b10.geometryUserPtr = pGVar2->userPtr;
                      local_b10.context = context->user;
                      local_b10.hit = (RTCHitN *)local_520;
                      local_b10.N = 8;
                      local_b10.ray = (RTCRayN *)ray;
                      if (pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar259 = ZEXT1664(_local_a40);
                        (*pGVar2->occlusionFilterN)(&local_b10);
                        auVar157 = ZEXT816(0) << 0x40;
                      }
                      auVar164 = ZEXT1632(auVar157);
                      auVar95 = vpcmpeqd_avx2(local_940,auVar164);
                      auVar95 = _DAT_01fe9960 & ~auVar95;
                      if ((((((((auVar95 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar95 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar95 >> 0x5f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) || SUB321(auVar95 >> 0x7f,0) != '\0') ||
                            (auVar95 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar95 >> 0xbf,0) != '\0') ||
                          (auVar95 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar95[0x1f] < '\0') {
                        p_Var3 = context->args->filter;
                        if ((p_Var3 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar2->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar259 = ZEXT1664(auVar259._0_16_);
                          (*p_Var3)(&local_b10);
                          auVar164 = ZEXT832(0) << 0x40;
                        }
                        auVar164 = vpcmpeqd_avx2(local_940,auVar164);
                        auVar134._8_4_ = 0xff800000;
                        auVar134._0_8_ = 0xff800000ff800000;
                        auVar134._12_4_ = 0xff800000;
                        auVar134._16_4_ = 0xff800000;
                        auVar134._20_4_ = 0xff800000;
                        auVar134._24_4_ = 0xff800000;
                        auVar134._28_4_ = 0xff800000;
                        auVar95 = vblendvps_avx(auVar134,*(undefined1 (*) [32])
                                                          (local_b10.ray + 0x100),auVar164);
                        *(undefined1 (*) [32])(local_b10.ray + 0x100) = auVar95;
                        auVar95 = _DAT_01fe9960 & ~auVar164;
                        if ((((((((auVar95 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 || (auVar95 >> 0x3f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                (auVar95 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || SUB321(auVar95 >> 0x7f,0) != '\0') ||
                              (auVar95 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                             SUB321(auVar95 >> 0xbf,0) != '\0') ||
                            (auVar95 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                            auVar95[0x1f] < '\0') {
                          bVar69 = 1;
                          goto LAB_015e8613;
                        }
                      }
                      *(float *)(ray + k * 4 + 0x100) = fVar139;
                    }
                    bVar69 = 0;
                    goto LAB_015e8613;
                  }
                }
                bVar78 = uVar75 < 4;
                uVar75 = uVar75 + 1;
              } while (uVar75 != 5);
              bVar78 = false;
              bVar69 = 5;
LAB_015e8613:
              bVar77 = (bool)(bVar77 | bVar78 & bVar69);
              uVar80 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar104._4_4_ = uVar80;
              auVar104._0_4_ = uVar80;
              auVar104._8_4_ = uVar80;
              auVar104._12_4_ = uVar80;
              auVar104._16_4_ = uVar80;
              auVar104._20_4_ = uVar80;
              auVar104._24_4_ = uVar80;
              auVar104._28_4_ = uVar80;
              auVar164 = vcmpps_avx(_local_8c0,auVar104,2);
              auVar95 = vandps_avx(auVar164,local_700);
              auVar164 = local_700 & auVar164;
              local_700 = auVar95;
            } while ((((((((auVar164 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar164 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar164 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar164 >> 0x7f,0) != '\0') ||
                       (auVar164 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar164 >> 0xbf,0) != '\0') ||
                     (auVar164 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar164[0x1f] < '\0');
          }
          auVar165._0_4_ = (float)local_960._0_4_ + local_560._0_4_;
          auVar165._4_4_ = (float)local_960._4_4_ + local_560._4_4_;
          auVar165._8_4_ = fStack_958 + local_560._8_4_;
          auVar165._12_4_ = fStack_954 + local_560._12_4_;
          auVar165._16_4_ = fStack_950 + local_560._16_4_;
          auVar165._20_4_ = fStack_94c + local_560._20_4_;
          auVar165._24_4_ = fStack_948 + local_560._24_4_;
          auVar165._28_4_ = fStack_944 + local_560._28_4_;
          auVar164 = vcmpps_avx(auVar165,auVar104,2);
          auVar95 = vandps_avx(local_740,local_720);
          auVar95 = vandps_avx(auVar164,auVar95);
          auVar186._0_4_ = (float)local_960._0_4_ + local_400._0_4_;
          auVar186._4_4_ = (float)local_960._4_4_ + local_400._4_4_;
          auVar186._8_4_ = fStack_958 + local_400._8_4_;
          auVar186._12_4_ = fStack_954 + local_400._12_4_;
          auVar186._16_4_ = fStack_950 + local_400._16_4_;
          auVar186._20_4_ = fStack_94c + local_400._20_4_;
          auVar186._24_4_ = fStack_948 + local_400._24_4_;
          auVar186._28_4_ = fStack_944 + local_400._28_4_;
          auVar96 = vcmpps_avx(auVar186,auVar104,2);
          auVar164 = vandps_avx(_local_900,local_8e0);
          auVar164 = vandps_avx(auVar96,auVar164);
          auVar164 = vorps_avx(auVar95,auVar164);
          if ((((((((auVar164 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar164 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar164 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar164 >> 0x7f,0) != '\0') ||
                (auVar164 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar164 >> 0xbf,0) != '\0') ||
              (auVar164 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar164[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar76 * 0x60) = auVar164;
            auVar95 = vblendvps_avx(local_400,local_560,auVar95);
            *(undefined1 (*) [32])(auStack_160 + uVar76 * 0x60) = auVar95;
            uVar81 = vmovlps_avx(local_690);
            (&uStack_140)[uVar76 * 0xc] = uVar81;
            aiStack_138[uVar76 * 0x18] = local_cc4 + 1;
            iVar71 = iVar71 + 1;
          }
        }
      }
    }
    if (iVar71 == 0) break;
    uVar80 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar107._4_4_ = uVar80;
    auVar107._0_4_ = uVar80;
    auVar107._8_4_ = uVar80;
    auVar107._12_4_ = uVar80;
    auVar107._16_4_ = uVar80;
    auVar107._20_4_ = uVar80;
    auVar107._24_4_ = uVar80;
    auVar107._28_4_ = uVar80;
    uVar73 = -iVar71;
    pauVar72 = (undefined1 (*) [32])(auStack_180 + (ulong)(iVar71 - 1) * 0x60);
    fVar116 = (float)local_960._0_4_;
    fVar115 = (float)local_960._4_4_;
    fVar140 = fStack_958;
    fVar139 = fStack_954;
    fVar142 = fStack_950;
    fVar149 = fStack_94c;
    fVar144 = fStack_948;
    fVar141 = fStack_944;
    while( true ) {
      auVar95 = pauVar72[1];
      auVar135._0_4_ = fVar116 + auVar95._0_4_;
      auVar135._4_4_ = fVar115 + auVar95._4_4_;
      auVar135._8_4_ = fVar140 + auVar95._8_4_;
      auVar135._12_4_ = fVar139 + auVar95._12_4_;
      auVar135._16_4_ = fVar142 + auVar95._16_4_;
      auVar135._20_4_ = fVar149 + auVar95._20_4_;
      auVar135._24_4_ = fVar144 + auVar95._24_4_;
      auVar135._28_4_ = fVar141 + auVar95._28_4_;
      auVar96 = vcmpps_avx(auVar135,auVar107,2);
      auVar164 = vandps_avx(auVar96,*pauVar72);
      local_520 = auVar164;
      auVar96 = *pauVar72 & auVar96;
      if ((((((((auVar96 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar96 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar96 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar96 >> 0x7f,0) != '\0') ||
            (auVar96 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar96 >> 0xbf,0) != '\0') ||
          (auVar96 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar96[0x1f] < '\0') break;
      pauVar72 = pauVar72 + -3;
      uVar73 = uVar73 + 1;
      fVar116 = (float)local_960._0_4_;
      fVar115 = (float)local_960._4_4_;
      fVar140 = fStack_958;
      fVar139 = fStack_954;
      fVar142 = fStack_950;
      fVar149 = fStack_94c;
      fVar144 = fStack_948;
      fVar141 = fStack_944;
      if (uVar73 == 0) goto LAB_015e8c89;
    }
    auVar246 = ZEXT3264(local_ae0);
    auVar108._8_4_ = 0x7f800000;
    auVar108._0_8_ = 0x7f8000007f800000;
    auVar108._12_4_ = 0x7f800000;
    auVar108._16_4_ = 0x7f800000;
    auVar108._20_4_ = 0x7f800000;
    auVar108._24_4_ = 0x7f800000;
    auVar108._28_4_ = 0x7f800000;
    auVar95 = vblendvps_avx(auVar108,auVar95,auVar164);
    auVar96 = vshufps_avx(auVar95,auVar95,0xb1);
    auVar96 = vminps_avx(auVar95,auVar96);
    auVar159 = vshufpd_avx(auVar96,auVar96,5);
    auVar96 = vminps_avx(auVar96,auVar159);
    auVar159 = vpermpd_avx2(auVar96,0x4e);
    auVar96 = vminps_avx(auVar96,auVar159);
    auVar95 = vcmpps_avx(auVar95,auVar96,0);
    auVar96 = auVar164 & auVar95;
    if ((((((((auVar96 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar96 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar96 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar96 >> 0x7f,0) != '\0') ||
          (auVar96 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar96 >> 0xbf,0) != '\0') ||
        (auVar96 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar96[0x1f] < '\0')
    {
      auVar164 = vandps_avx(auVar95,auVar164);
    }
    uVar75 = *(ulong *)pauVar72[2];
    auVar93._8_8_ = 0;
    auVar93._0_8_ = uVar75;
    uVar74 = vmovmskps_avx(auVar164);
    iVar71 = 0;
    for (; (uVar74 & 1) == 0; uVar74 = uVar74 >> 1 | 0x80000000) {
      iVar71 = iVar71 + 1;
    }
    *(undefined4 *)(local_520 + (uint)(iVar71 << 2)) = 0;
    uVar74 = ~uVar73;
    if ((((((((local_520 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (local_520 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (local_520 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(local_520 >> 0x7f,0) != '\0') ||
          (local_520 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(local_520 >> 0xbf,0) != '\0') ||
        (local_520 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_520[0x1f] < '\0') {
      uVar74 = -uVar73;
    }
    uVar76 = (ulong)uVar74;
    local_cc4 = *(int *)(pauVar72[2] + 8);
    *pauVar72 = local_520;
    uVar80 = (undefined4)uVar75;
    auVar136._4_4_ = uVar80;
    auVar136._0_4_ = uVar80;
    auVar136._8_4_ = uVar80;
    auVar136._12_4_ = uVar80;
    auVar136._16_4_ = uVar80;
    auVar136._20_4_ = uVar80;
    auVar136._24_4_ = uVar80;
    auVar136._28_4_ = uVar80;
    auVar84 = vmovshdup_avx(auVar93);
    auVar84 = vsubps_avx(auVar84,auVar93);
    auVar109._0_4_ = auVar84._0_4_;
    auVar109._4_4_ = auVar109._0_4_;
    auVar109._8_4_ = auVar109._0_4_;
    auVar109._12_4_ = auVar109._0_4_;
    auVar109._16_4_ = auVar109._0_4_;
    auVar109._20_4_ = auVar109._0_4_;
    auVar109._24_4_ = auVar109._0_4_;
    auVar109._28_4_ = auVar109._0_4_;
    auVar84 = vfmadd132ps_fma(auVar109,auVar136,_DAT_01faff20);
    local_560 = ZEXT1632(auVar84);
    local_690._8_8_ = 0;
    local_690._0_8_ = *(ulong *)(local_560 + (uint)(iVar71 << 2));
    auVar95 = auVar263;
  } while( true );
LAB_015e8c89:
  if (bVar77 != false) {
    return bVar77;
  }
  uVar80 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar94._4_4_ = uVar80;
  auVar94._0_4_ = uVar80;
  auVar94._8_4_ = uVar80;
  auVar94._12_4_ = uVar80;
  auVar4 = vcmpps_avx(local_6a0,auVar94,2);
  uVar70 = vmovmskps_avx(auVar4);
  uVar70 = uVar70 & (uint)local_908 - 1 & (uint)local_908;
  if (uVar70 == 0) {
    return false;
  }
  goto LAB_015e657b;
}

Assistant:

static __forceinline bool occluded_h(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID));
          if (Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }